

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  undefined4 *puVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  Layer *pLVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  Mat *pMVar40;
  int u;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  long lVar46;
  undefined1 (*pauVar47) [32];
  long lVar48;
  undefined1 (*pauVar49) [16];
  uint uVar50;
  uint uVar51;
  long lVar52;
  int iVar53;
  ulong uVar54;
  uint uVar55;
  int iVar56;
  int i;
  int iVar57;
  ulong uVar58;
  uint uVar59;
  int iVar60;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  int i_1;
  int iVar64;
  long lVar65;
  float *pfVar66;
  void *pvVar67;
  undefined1 (*pauVar68) [32];
  undefined1 (*pauVar69) [16];
  uint uVar70;
  void *pvVar71;
  float *pfVar72;
  int y_5;
  int iVar73;
  void *pvVar74;
  ulong uVar75;
  int y;
  int iVar76;
  uint uVar77;
  int iVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  void *pvVar83;
  bool bVar84;
  float fVar85;
  undefined4 uVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar122;
  float fVar123;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar152 [28];
  undefined1 auVar153 [28];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar154 [28];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar225;
  float fVar229;
  float fVar230;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar212 [32];
  float fVar231;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar217 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [32];
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 in_ZMM3 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  __m128 pos;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  float fVar318;
  undefined1 auVar313 [32];
  float fVar322;
  undefined1 auVar314 [32];
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  float fVar323;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar336 [32];
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 (*local_240) [16];
  void *local_1e8;
  undefined1 (*local_1e0) [32];
  Mat local_198;
  int local_150;
  int local_14c;
  void *local_148;
  Option *local_140;
  ulong local_138;
  Mat *local_130;
  void *local_128;
  long local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  undefined1 auVar211 [32];
  undefined1 auVar213 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [32];
  undefined1 auVar221 [32];
  undefined1 auVar276 [32];
  undefined1 auVar284 [32];
  undefined1 auVar291 [32];
  
  iVar73 = bottom_blob->w;
  iVar56 = bottom_blob->h;
  uVar63 = bottom_blob->elemsize;
  iVar78 = bottom_blob->elempack;
  uVar45 = (this->super_Deconvolution).num_output;
  if (opt->use_packing_layout == true) {
    uVar59 = 8;
    if ((uVar45 & 7) != 0) {
      uVar59 = (uint)((uVar45 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar59 = 1;
  }
  iVar41 = (this->super_Deconvolution).kernel_w;
  local_150 = (this->super_Deconvolution).dilation_w;
  iVar53 = (this->super_Deconvolution).stride_w;
  local_14c = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar57 = (this->super_Deconvolution).stride_h;
  iVar76 = (this->super_Deconvolution).output_pad_right;
  iVar11 = (this->super_Deconvolution).output_pad_bottom;
  uVar80 = (long)(int)uVar45 / (long)(int)uVar59 & 0xffffffff;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  auVar171._0_4_ = (this->super_Deconvolution).pad_left;
  auVar171._4_4_ = (this->super_Deconvolution).pad_right;
  auVar171._8_4_ = (this->super_Deconvolution).pad_top;
  auVar171._12_4_ = (this->super_Deconvolution).pad_bottom;
  auVar171 = vpcmpgtd_avx(auVar171,(undefined1  [16])0x0);
  lVar48 = 0x10;
  if (((((auVar171 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar171 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar171 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar171[0xf])
     && ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1))
         && (lVar48 = 8, &local_198 != top_blob)))) {
    piVar13 = top_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    local_198.data = top_blob->data;
    local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_198.elemsize = top_blob->elemsize;
    local_198.elempack = top_blob->elempack;
    local_198.allocator = top_blob->allocator;
    uVar7 = top_blob->dims;
    uVar8 = top_blob->w;
    uVar9 = top_blob->h;
    uVar10 = top_blob->d;
    local_198.c = top_blob->c;
    local_198.cstep = top_blob->cstep;
    local_198.dims = uVar7;
    local_198.w = uVar8;
    local_198.h = uVar9;
    local_198.d = uVar10;
  }
  local_150 = (iVar41 + -1) * local_150;
  iVar76 = (iVar73 + -1) * iVar53 + local_150 + iVar76 + 1;
  iVar53 = (int)((long)(int)uVar45 / (long)(int)uVar59);
  local_140 = opt;
  local_130 = top_blob;
  Mat::create(&local_198,iVar76,iVar11 + (iVar56 + -1) * iVar57 + local_14c + 1,iVar53,
              (uVar63 / (ulong)(long)iVar78) * (ulong)uVar59,uVar59,
              *(Allocator **)(&opt->lightmode + lVar48));
  iVar41 = -100;
  if ((local_198.data != (void *)0x0) && (local_198.cstep * (long)local_198.c != 0)) {
    uVar45 = (this->super_Deconvolution).kernel_w;
    uVar12 = (this->super_Deconvolution).kernel_h;
    local_148 = (void *)(long)(int)(uVar12 * uVar45);
    if (local_140->use_sgemm_convolution == true) {
      piVar13 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar78 = bottom_blob->h;
      iVar41 = bottom_blob->w;
      uVar35 = bottom_blob->dims;
      uVar36 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
        iVar41 = bottom_blob->w;
        iVar78 = bottom_blob->h;
      }
      local_d8 = 0;
      _local_a0 = CONCAT44(iVar78 * iVar41,uVar35);
      _uStack_98 = CONCAT44(uVar36,1);
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_140->lightmode;
      opt_b.use_shader_pack8 = local_140->use_shader_pack8;
      opt_b.use_subgroup_ops = local_140->use_subgroup_ops;
      opt_b.use_reserved_0 = local_140->use_reserved_0;
      opt_b.num_threads = local_140->num_threads;
      opt_b.workspace_allocator = local_140->workspace_allocator;
      opt_b.openmp_blocktime = local_140->openmp_blocktime;
      opt_b.use_winograd_convolution = local_140->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_140->use_sgemm_convolution;
      opt_b.use_int8_inference = local_140->use_int8_inference;
      opt_b.use_vulkan_compute = local_140->use_vulkan_compute;
      opt_b.use_bf16_storage = local_140->use_bf16_storage;
      opt_b.use_fp16_packed = local_140->use_fp16_packed;
      opt_b.use_fp16_storage = local_140->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_140->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_140->use_int8_packed;
      opt_b.use_int8_storage = local_140->use_int8_storage;
      opt_b.use_int8_arithmetic = local_140->use_int8_arithmetic;
      opt_b.use_packing_layout = local_140->use_packing_layout;
      opt_b.vulkan_device_index = local_140->vulkan_device_index;
      opt_b.use_reserved_1 = local_140->use_reserved_1;
      opt_b.use_image_storage = local_140->use_image_storage;
      opt_b.use_tensor_storage = local_140->use_tensor_storage;
      opt_b.use_reserved_2 = local_140->use_reserved_2;
      opt_b.flush_denormals = local_140->flush_denormals;
      opt_b.use_local_pool_allocator = local_140->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_140->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_140->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_140->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_140->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_140->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_140->use_a53_a55_optimized_kernel;
      opt_b.use_fp16_uniform = local_140->use_fp16_uniform;
      opt_b.use_int8_uniform = local_140->use_int8_uniform;
      opt_b.use_reserved_9 = local_140->use_reserved_9;
      opt_b.use_reserved_10 = local_140->use_reserved_10;
      opt_b.use_reserved_11 = local_140->use_reserved_11;
      opt_b.blob_allocator = local_198.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      iVar41 = (*this->gemm->_vptr_Layer[7])();
      if (iVar41 != 0) {
        piVar13 = (int *)CONCAT44(iStack_10c,uStack_110);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_f8 == (long *)0x0) {
              free(local_118);
            }
            else {
              (**(code **)(*local_f8 + 0x18))();
            }
          }
        }
        if (piStack_c0 != (int *)0x0) {
          LOCK();
          *piStack_c0 = *piStack_c0 + -1;
          UNLOCK();
          if (*piStack_c0 == 0) {
            if (local_a8 == (Allocator *)0x0) {
              free(local_c8);
            }
            else {
              (*local_a8->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_0027fed8;
      }
      iVar78 = (iVar76 * (this->super_Deconvolution).stride_h -
               (this->super_Deconvolution).stride_w * iVar73) * uVar59;
      if (uVar59 == 1) {
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        if (iVar53 < 1) {
          uVar80 = 0;
        }
        lVar48 = (long)local_198.h * (long)local_198.w;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        iVar41 = (this->super_Deconvolution).bias_data.c;
        sVar17 = (this->super_Deconvolution).bias_data.cstep;
        iVar53 = (this->super_Deconvolution).kernel_h;
        if (iVar53 < 1) {
          iVar53 = 0;
        }
        lVar62 = iStack_ec * local_108 * (long)local_148;
        local_148 = local_198.data;
        pvVar83 = local_198.data;
        for (uVar63 = 0; uVar63 != uVar80; uVar63 = uVar63 + 1) {
          iVar57 = (int)((local_198.elemsize * lVar48 + 0xf & 0xfffffffffffffff0) /
                        local_198.elemsize);
          if (local_198.dims == 4) {
            iVar57 = (int)lVar48;
          }
          uVar86 = 0;
          if ((long)iVar41 * sVar17 != 0 && pvVar16 != (void *)0x0) {
            uVar86 = *(undefined4 *)((long)pvVar16 + uVar63 * 4);
          }
          pfVar66 = (float *)(uVar63 * lVar62 + (long)local_118);
          iVar57 = iVar57 * local_198.d;
          if (iVar57 < 1) {
            iVar57 = 0;
          }
          for (lVar52 = 0; iVar57 != (int)lVar52; lVar52 = lVar52 + 1) {
            *(undefined4 *)((long)pvVar83 + lVar52 * 4) = uVar86;
          }
          uVar45 = (this->super_Deconvolution).kernel_w;
          uVar75 = 0;
          uVar58 = (ulong)uVar45;
          if ((int)uVar45 < 1) {
            uVar58 = uVar75;
          }
          while (iVar57 = (int)uVar75, iVar57 != iVar53) {
            iVar76 = (this->super_Deconvolution).dilation_h;
            iVar11 = (this->super_Deconvolution).dilation_w;
            for (uVar75 = 0; uVar75 != uVar58; uVar75 = uVar75 + 1) {
              pfVar72 = (float *)((long)local_198.data +
                                 uVar75 * (long)iVar11 * 4 +
                                 (long)iVar57 * (long)iVar76 *
                                 (long)local_198.w * local_198.elemsize +
                                 local_198.cstep * local_198.elemsize * uVar63);
              for (iVar64 = 0; iVar64 != iVar56; iVar64 = iVar64 + 1) {
                iVar42 = (this->super_Deconvolution).stride_w;
                iVar60 = iVar73;
                while (bVar84 = iVar60 != 0, iVar60 = iVar60 + -1, bVar84) {
                  *pfVar72 = *pfVar72 + *pfVar66;
                  pfVar66 = pfVar66 + 1;
                  pfVar72 = pfVar72 + iVar42;
                }
                pfVar72 = pfVar72 + iVar78;
              }
            }
            uVar75 = (ulong)(iVar57 + 1);
          }
          pvVar83 = (void *)((long)pvVar83 + local_198.cstep * local_198.elemsize);
        }
      }
      else if (uVar59 == 4) {
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        if (iVar53 < 1) {
          uVar80 = 0;
        }
        for (uVar63 = 0; uVar63 != uVar80; uVar63 = uVar63 + 1) {
          pfVar66 = (float *)((long)iStack_ec * uVar63 * (long)local_148 * local_108 +
                             (long)local_118);
          pauVar69 = (undefined1 (*) [16])
                     (local_198.cstep * uVar63 * local_198.elemsize + (long)local_198.data);
          uVar75 = (long)local_198.h * (long)local_198.w;
          uVar58 = (local_198.elemsize * uVar75 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar58 = uVar75;
          }
          pvVar16 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar16 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar41 = local_198.d * (int)uVar58;
            pauVar49 = pauVar69;
            if (iVar41 < 1) {
              iVar41 = 0;
            }
            while (iVar41 != 0) {
              *(undefined8 *)*pauVar49 = 0;
              *(undefined8 *)(*pauVar49 + 8) = 0;
              pauVar49 = pauVar49 + 1;
              iVar41 = iVar41 + -1;
            }
          }
          else {
            auVar171 = *(undefined1 (*) [16])((long)pvVar16 + uVar63 * 0x10);
            iVar41 = local_198.d * (int)uVar58;
            pauVar49 = pauVar69;
            if (iVar41 < 1) {
              iVar41 = 0;
            }
            while (iVar41 != 0) {
              *pauVar49 = auVar171;
              pauVar49 = pauVar49 + 1;
              iVar41 = iVar41 + -1;
            }
          }
          for (iVar41 = 0; iVar41 < (this->super_Deconvolution).kernel_h; iVar41 = iVar41 + 1) {
            for (iVar53 = 0; iVar53 < (this->super_Deconvolution).kernel_w; iVar53 = iVar53 + 1) {
              pauVar49 = (undefined1 (*) [16])
                         (*pauVar69 +
                         (long)((this->super_Deconvolution).dilation_w * iVar53 * 4) * 4 +
                         (long)iVar41 * (long)(this->super_Deconvolution).dilation_h *
                         local_198.elemsize * (long)local_198.w);
              for (iVar57 = 0; iVar76 = iVar73, iVar57 != iVar56; iVar57 = iVar57 + 1) {
                while (iVar76 != 0) {
                  auVar120._0_4_ = *pfVar66 + *(float *)*pauVar49;
                  auVar120._4_4_ = pfVar66[1] + *(float *)(*pauVar49 + 4);
                  auVar120._8_4_ = pfVar66[2] + *(float *)(*pauVar49 + 8);
                  auVar120._12_4_ = pfVar66[3] + *(float *)(*pauVar49 + 0xc);
                  *pauVar49 = auVar120;
                  pauVar49 = pauVar49 + (this->super_Deconvolution).stride_w;
                  pfVar66 = pfVar66 + 4;
                  iVar76 = iVar76 + -1;
                }
                pauVar49 = (undefined1 (*) [16])(*pauVar49 + (long)iVar78 * 4);
              }
            }
          }
        }
      }
      else if (uVar59 == 8) {
        if (iVar73 < 1) {
          iVar73 = 0;
        }
        if (iVar56 < 1) {
          iVar56 = 0;
        }
        if (iVar53 < 1) {
          uVar80 = 0;
        }
        for (uVar63 = 0; uVar63 != uVar80; uVar63 = uVar63 + 1) {
          pfVar66 = (float *)((long)iStack_ec * uVar63 * (long)local_148 * local_108 +
                             (long)local_118);
          pauVar68 = (undefined1 (*) [32])
                     (local_198.cstep * uVar63 * local_198.elemsize + (long)local_198.data);
          uVar75 = (long)local_198.h * (long)local_198.w;
          uVar58 = (local_198.elemsize * uVar75 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar58 = uVar75;
          }
          pvVar16 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar16 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar41 = local_198.d * (int)uVar58;
            pauVar47 = pauVar68;
            if (iVar41 < 1) {
              iVar41 = 0;
            }
            while (iVar41 != 0) {
              *(undefined8 *)*pauVar47 = 0;
              *(undefined8 *)(*pauVar47 + 8) = 0;
              *(undefined8 *)(*pauVar47 + 0x10) = 0;
              *(undefined8 *)(*pauVar47 + 0x18) = 0;
              pauVar47 = pauVar47 + 1;
              iVar41 = iVar41 + -1;
            }
          }
          else {
            auVar237 = *(undefined1 (*) [32])((long)pvVar16 + uVar63 * 0x20);
            iVar41 = local_198.d * (int)uVar58;
            pauVar47 = pauVar68;
            if (iVar41 < 1) {
              iVar41 = 0;
            }
            while (iVar41 != 0) {
              *pauVar47 = auVar237;
              pauVar47 = pauVar47 + 1;
              iVar41 = iVar41 + -1;
            }
          }
          for (iVar41 = 0; iVar41 < (this->super_Deconvolution).kernel_h; iVar41 = iVar41 + 1) {
            for (iVar53 = 0; iVar53 < (this->super_Deconvolution).kernel_w; iVar53 = iVar53 + 1) {
              pauVar47 = (undefined1 (*) [32])
                         (*pauVar68 +
                         (long)((this->super_Deconvolution).dilation_w * iVar53 * 8) * 4 +
                         (long)iVar41 * (long)(this->super_Deconvolution).dilation_h *
                         local_198.elemsize * (long)local_198.w);
              for (iVar57 = 0; iVar76 = iVar73, iVar57 != iVar56; iVar57 = iVar57 + 1) {
                while (iVar76 != 0) {
                  auVar121._0_4_ = *pfVar66 + *(float *)*pauVar47;
                  auVar121._4_4_ = pfVar66[1] + *(float *)(*pauVar47 + 4);
                  auVar121._8_4_ = pfVar66[2] + *(float *)(*pauVar47 + 8);
                  auVar121._12_4_ = pfVar66[3] + *(float *)(*pauVar47 + 0xc);
                  auVar121._16_4_ = pfVar66[4] + *(float *)(*pauVar47 + 0x10);
                  auVar121._20_4_ = pfVar66[5] + *(float *)(*pauVar47 + 0x14);
                  auVar121._24_4_ = pfVar66[6] + *(float *)(*pauVar47 + 0x18);
                  auVar121._28_4_ = pfVar66[7] + *(float *)(*pauVar47 + 0x1c);
                  *pauVar47 = auVar121;
                  pauVar47 = pauVar47 + (this->super_Deconvolution).stride_w;
                  pfVar66 = pfVar66 + 8;
                  iVar76 = iVar76 + -1;
                }
                pauVar47 = (undefined1 (*) [32])(*pauVar47 + (long)iVar78 * 4);
              }
            }
          }
        }
      }
      pLVar18 = this->activation;
      if (pLVar18 != (Layer *)0x0) {
        (*pLVar18->_vptr_Layer[9])(pLVar18,&local_198,local_140);
      }
      piVar13 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if ((iVar78 == 8) && (uVar59 == 8)) {
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        uVar80 = 0;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar75 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar75 = uVar80;
        }
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar308 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar237._8_4_ = 0x3f800000;
        auVar237._0_8_ = 0x3f8000003f800000;
        auVar237._12_4_ = 0x3f800000;
        auVar237._16_4_ = 0x3f800000;
        auVar237._20_4_ = 0x3f800000;
        auVar237._24_4_ = 0x3f800000;
        auVar237._28_4_ = 0x3f800000;
        for (; uVar80 != uVar75; uVar80 = uVar80 + 1) {
          local_1e0 = (undefined1 (*) [32])
                      (local_198.cstep * uVar80 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar50 = 0;
          uVar43 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar43 = uVar50;
          }
          uVar77 = local_198.w;
          if (local_198.w < 1) {
            uVar77 = 0;
          }
          uVar51 = local_198.h;
          if (local_198.h < 1) {
            uVar51 = 0;
          }
          for (; uVar50 != uVar51; uVar50 = uVar50 + 1) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar55 = 0; uVar55 != uVar77; uVar55 = uVar55 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar315 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + uVar80 * 0x20));
              }
              pvVar83 = bottom_blob->data;
              lVar48 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar80 * (this->weight_data_tm).elemsize +
                       0xe0;
              for (uVar54 = 0; uVar54 != uVar43; uVar54 = uVar54 + 1) {
                lVar62 = lVar48;
                for (uVar79 = 0; uVar79 != uVar58; uVar79 = uVar79 + 1) {
                  iVar42 = (((int)uVar79 - uVar12) + 1) * iVar56 + uVar50;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    lVar52 = (long)iVar60 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar54;
                    iVar42 = iVar64;
                    for (lVar65 = 0; uVar63 * 0x100 != lVar65; lVar65 = lVar65 + 0x100) {
                      if (((-1 < iVar42) && (iVar60 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar60 < iVar76)) {
                        lVar46 = (long)(iVar60 << 3);
                        fVar85 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52);
                        fVar105 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 4);
                        fVar122 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 8);
                        fVar123 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0xc);
                        fVar231 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x10);
                        fVar124 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x14);
                        fVar228 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x18);
                        fVar230 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x1c);
                        pfVar4 = (float *)(lVar62 + -0xe0 + lVar65);
                        pfVar5 = (float *)(lVar62 + -0xc0 + lVar65);
                        pfVar6 = (float *)(lVar62 + -0xa0 + lVar65);
                        pfVar72 = (float *)(lVar62 + -0x80 + lVar65);
                        pfVar1 = (float *)(lVar62 + -0x60 + lVar65);
                        pfVar2 = (float *)(lVar62 + -0x40 + lVar65);
                        fVar229 = fVar122 + fVar123 + fVar122;
                        pfVar3 = (float *)(lVar62 + -0x20 + lVar65);
                        pfVar66 = (float *)(lVar62 + lVar65);
                        fVar170 = fVar228 * *pfVar3 + fVar230 * *pfVar66;
                        fVar223 = fVar228 * pfVar3[1] + fVar230 * pfVar66[1];
                        fVar224 = fVar228 * pfVar3[2] + fVar230 * pfVar66[2];
                        fVar225 = fVar228 * pfVar3[3] + fVar230 * pfVar66[3];
                        fVar226 = fVar228 * pfVar3[4] + fVar230 * pfVar66[4];
                        fVar227 = fVar228 * pfVar3[5] + fVar230 * pfVar66[5];
                        fVar228 = fVar228 * pfVar3[6] + fVar230 * pfVar66[6];
                        fVar230 = fVar229 + fVar122;
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar230,CONCAT424(fVar228,CONCAT420(fVar227,
                                                  CONCAT416(fVar226,CONCAT412(fVar225,CONCAT48(
                                                  fVar224,CONCAT44(fVar223,fVar170))))))));
                        auVar315 = ZEXT3264(CONCAT428(auVar315._28_4_ + fVar85 + fVar105 + fVar122 +
                                                      fVar229 + fVar230,
                                                      CONCAT424(auVar315._24_4_ + fVar85 * pfVar4[6]
                                                                + fVar105 * pfVar5[6] +
                                                                  fVar122 * pfVar6[6] +
                                                                fVar123 * pfVar72[6] +
                                                                fVar231 * pfVar1[6] +
                                                                fVar124 * pfVar2[6] + fVar228,
                                                                CONCAT420(auVar315._20_4_ +
                                                                          fVar85 * pfVar4[5] +
                                                                          fVar105 * pfVar5[5] +
                                                                          fVar122 * pfVar6[5] +
                                                                          fVar123 * pfVar72[5] +
                                                                          fVar231 * pfVar1[5] +
                                                                          fVar124 * pfVar2[5] +
                                                                          fVar227,CONCAT416(auVar315
                                                  ._16_4_ + fVar85 * pfVar4[4] +
                                                  fVar105 * pfVar5[4] + fVar122 * pfVar6[4] +
                                                  fVar123 * pfVar72[4] + fVar231 * pfVar1[4] +
                                                  fVar124 * pfVar2[4] + fVar226,
                                                  CONCAT412(auVar315._12_4_ + fVar85 * pfVar4[3] +
                                                            fVar105 * pfVar5[3] +
                                                            fVar122 * pfVar6[3] +
                                                            fVar123 * pfVar72[3] +
                                                            fVar231 * pfVar1[3] +
                                                            fVar124 * pfVar2[3] + fVar225,
                                                            CONCAT48(auVar315._8_4_ +
                                                                     fVar85 * pfVar4[2] +
                                                                     fVar105 * pfVar5[2] +
                                                                     fVar122 * pfVar6[2] +
                                                                     fVar123 * pfVar72[2] +
                                                                     fVar231 * pfVar1[2] +
                                                                     fVar124 * pfVar2[2] + fVar224,
                                                                     CONCAT44(auVar315._4_4_ +
                                                                              fVar85 * pfVar4[1] +
                                                                              fVar105 * pfVar5[1] +
                                                                              fVar122 * pfVar6[1] +
                                                                              fVar123 * pfVar72[1] +
                                                                              fVar231 * pfVar1[1] +
                                                                              fVar124 * pfVar2[1] +
                                                                              fVar223,auVar315._0_4_
                                                                                      + fVar85 * *
                                                  pfVar4 + fVar105 * *pfVar5 + fVar122 * *pfVar6 +
                                                  fVar123 * *pfVar72 + fVar231 * *pfVar1 +
                                                  fVar124 * *pfVar2 + fVar170))))))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  lVar62 = lVar62 + (long)(int)uVar45 * 0x100;
                }
                lVar48 = lVar48 + (long)(int)(uVar45 * uVar12 * 0x40) * 4;
              }
              auVar161 = auVar315._0_32_;
              if (5 < iVar57 - 1U) goto LAB_0027c138;
              auVar93 = auVar104._0_32_;
              auVar273 = vmaxps_avx(auVar161,auVar93);
              fVar170 = auVar315._8_4_;
              fVar223 = auVar315._12_4_;
              fVar224 = auVar315._16_4_;
              fVar225 = auVar315._20_4_;
              fVar226 = auVar315._24_4_;
              fVar85 = auVar308._0_4_;
              fVar105 = auVar308._4_4_;
              fVar122 = auVar308._8_4_;
              fVar123 = auVar308._12_4_;
              fVar231 = auVar308._16_4_;
              fVar124 = auVar308._20_4_;
              fVar228 = auVar308._24_4_;
              fVar230 = auVar308._28_4_;
              switch(iVar57) {
              case 2:
                auVar161 = vminps_avx(auVar161,auVar93);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar270._0_4_ = fVar85 * auVar161._0_4_ + auVar273._0_4_;
                auVar270._4_4_ = fVar85 * auVar161._4_4_ + auVar273._4_4_;
                auVar270._8_4_ = fVar85 * auVar161._8_4_ + auVar273._8_4_;
                auVar270._12_4_ = fVar85 * auVar161._12_4_ + auVar273._12_4_;
                auVar270._16_4_ = fVar85 * auVar161._16_4_ + auVar273._16_4_;
                auVar270._20_4_ = fVar85 * auVar161._20_4_ + auVar273._20_4_;
                auVar270._24_4_ = fVar85 * auVar161._24_4_ + auVar273._24_4_;
                auVar270._28_4_ = auVar161._28_4_ + auVar273._28_4_;
                auVar273 = auVar270;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar274._4_4_ = uVar86;
                auVar274._0_4_ = uVar86;
                auVar274._8_4_ = uVar86;
                auVar274._12_4_ = uVar86;
                auVar274._16_4_ = uVar86;
                auVar274._20_4_ = uVar86;
                auVar274._24_4_ = uVar86;
                auVar274._28_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar336._4_4_ = uVar86;
                auVar336._0_4_ = uVar86;
                auVar336._8_4_ = uVar86;
                auVar336._12_4_ = uVar86;
                auVar336._16_4_ = uVar86;
                auVar336._20_4_ = uVar86;
                auVar336._24_4_ = uVar86;
                auVar336._28_4_ = uVar86;
                auVar161 = vmaxps_avx(auVar161,auVar274);
                auVar273 = vminps_avx(auVar336,auVar161);
                break;
              case 4:
                auVar275._0_8_ = auVar315._0_8_ ^ 0x8000000080000000;
                auVar275._8_4_ = -fVar170;
                auVar275._12_4_ = -fVar223;
                auVar275._16_4_ = -fVar224;
                auVar275._20_4_ = -fVar225;
                auVar275._24_4_ = -fVar226;
                auVar275._28_4_ = -auVar315._28_4_;
                auVar158._8_4_ = 0x42b0c0a5;
                auVar158._0_8_ = 0x42b0c0a542b0c0a5;
                auVar158._12_4_ = 0x42b0c0a5;
                auVar158._16_4_ = 0x42b0c0a5;
                auVar158._20_4_ = 0x42b0c0a5;
                auVar158._24_4_ = 0x42b0c0a5;
                auVar158._28_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar275,auVar158);
                auVar159._8_4_ = 0xc2b0c0a5;
                auVar159._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar159._12_4_ = 0xc2b0c0a5;
                auVar159._16_4_ = 0xc2b0c0a5;
                auVar159._20_4_ = 0xc2b0c0a5;
                auVar159._24_4_ = 0xc2b0c0a5;
                auVar159._28_4_ = 0xc2b0c0a5;
                auVar273 = vmaxps_avx(auVar161,auVar159);
                auVar312._0_4_ = auVar273._0_4_ * 1.442695 + fVar85;
                auVar312._4_4_ = auVar273._4_4_ * 1.442695 + fVar105;
                auVar312._8_4_ = auVar273._8_4_ * 1.442695 + fVar122;
                auVar312._12_4_ = auVar273._12_4_ * 1.442695 + fVar123;
                auVar312._16_4_ = auVar273._16_4_ * 1.442695 + fVar231;
                auVar312._20_4_ = auVar273._20_4_ * 1.442695 + fVar124;
                auVar312._24_4_ = auVar273._24_4_ * 1.442695 + fVar228;
                auVar312._28_4_ = auVar315._28_4_ + fVar230;
                auVar93 = vroundps_avx(auVar312,1);
                auVar161 = vcmpps_avx(auVar312,auVar93,1);
                auVar161 = vandps_avx(auVar161,auVar237);
                auVar161 = vsubps_avx(auVar93,auVar161);
                fVar170 = auVar161._0_4_ * -0.6931472 + auVar273._0_4_;
                fVar223 = auVar161._4_4_ * -0.6931472 + auVar273._4_4_;
                fVar224 = auVar161._8_4_ * -0.6931472 + auVar273._8_4_;
                fVar225 = auVar161._12_4_ * -0.6931472 + auVar273._12_4_;
                fVar226 = auVar161._16_4_ * -0.6931472 + auVar273._16_4_;
                fVar227 = auVar161._20_4_ * -0.6931472 + auVar273._20_4_;
                fVar229 = auVar161._24_4_ * -0.6931472 + auVar273._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar240._0_4_ = (int)auVar161._0_4_;
                auVar240._4_4_ = (int)auVar161._4_4_;
                auVar240._8_4_ = (int)auVar161._8_4_;
                auVar240._12_4_ = (int)auVar161._12_4_;
                auVar276._16_4_ = (int)auVar161._16_4_;
                auVar276._0_16_ = auVar240;
                auVar276._20_4_ = (int)auVar161._20_4_;
                auVar276._24_4_ = (int)auVar161._24_4_;
                auVar276._28_4_ = (int)auVar161._28_4_;
                auVar239 = vpslld_avx(auVar240,0x17);
                auVar171 = vpslld_avx(auVar276._16_16_,0x17);
                auVar107._8_4_ = 0x3f800000;
                auVar107._0_8_ = 0x3f8000003f800000;
                auVar107._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar107);
                auVar239 = vpaddd_avx(auVar239,auVar107);
                auVar160._0_4_ =
                     (fVar170 + 1.0 +
                     fVar170 * fVar170 *
                     (fVar85 + ((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452)
                                 * fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170)) *
                     auVar239._0_4_ + 1.0;
                auVar160._4_4_ =
                     (fVar223 + 1.0 +
                     fVar223 * fVar223 *
                     (fVar105 +
                     ((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) * fVar223
                      + 0.041665796) * fVar223 + 0.16666666) * fVar223)) * auVar239._4_4_ + 1.0;
                auVar160._8_4_ =
                     (fVar224 + 1.0 +
                     fVar224 * fVar224 *
                     (fVar122 +
                     ((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                      + 0.041665796) * fVar224 + 0.16666666) * fVar224)) * auVar239._8_4_ + 1.0;
                auVar160._12_4_ =
                     (fVar225 + 1.0 +
                     fVar225 * fVar225 *
                     (fVar123 +
                     ((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                      + 0.041665796) * fVar225 + 0.16666666) * fVar225)) * auVar239._12_4_ + 1.0;
                auVar160._16_4_ =
                     (fVar226 + 1.0 +
                     fVar226 * fVar226 *
                     (fVar231 +
                     ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                      + 0.041665796) * fVar226 + 0.16666666) * fVar226)) * auVar171._0_4_ + 1.0;
                auVar160._20_4_ =
                     (fVar227 + 1.0 +
                     fVar227 * fVar227 *
                     (fVar124 +
                     ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                      + 0.041665796) * fVar227 + 0.16666666) * fVar227)) * auVar171._4_4_ + 1.0;
                auVar160._24_4_ =
                     (fVar229 + 1.0 +
                     fVar229 * fVar229 *
                     (fVar228 +
                     ((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                      + 0.041665796) * fVar229 + 0.16666666) * fVar229)) * auVar171._8_4_ + 1.0;
                auVar160._28_4_ =
                     auVar93._28_4_ + auVar273._28_4_ + 1.0 + fVar230 + 0.21826287 + 1.0;
                auVar273 = vdivps_avx(auVar237,auVar160);
                break;
              case 5:
                auVar303._8_4_ = 0x42b0c0a5;
                auVar303._0_8_ = 0x42b0c0a542b0c0a5;
                auVar303._12_4_ = 0x42b0c0a5;
                auVar303._16_4_ = 0x42b0c0a5;
                auVar303._20_4_ = 0x42b0c0a5;
                auVar303._24_4_ = 0x42b0c0a5;
                auVar303._28_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar161,auVar303);
                auVar305._8_4_ = 0xc2b0c0a5;
                auVar305._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar305._12_4_ = 0xc2b0c0a5;
                auVar305._16_4_ = 0xc2b0c0a5;
                auVar305._20_4_ = 0xc2b0c0a5;
                auVar305._24_4_ = 0xc2b0c0a5;
                auVar305._28_4_ = 0xc2b0c0a5;
                auVar93 = vmaxps_avx(auVar305,auVar161);
                auVar271._0_4_ = fVar85 + auVar93._0_4_ * 1.442695;
                auVar271._4_4_ = fVar105 + auVar93._4_4_ * 1.442695;
                auVar271._8_4_ = fVar122 + auVar93._8_4_ * 1.442695;
                auVar271._12_4_ = fVar123 + auVar93._12_4_ * 1.442695;
                auVar271._16_4_ = fVar231 + auVar93._16_4_ * 1.442695;
                auVar271._20_4_ = fVar124 + auVar93._20_4_ * 1.442695;
                auVar271._24_4_ = fVar228 + auVar93._24_4_ * 1.442695;
                auVar271._28_4_ = fVar230 + auVar273._28_4_;
                auVar273 = vroundps_avx(auVar271,1);
                auVar161 = vcmpps_avx(auVar271,auVar273,1);
                auVar161 = vandps_avx(auVar161,auVar237);
                auVar161 = vsubps_avx(auVar273,auVar161);
                auVar26._4_4_ = auVar161._4_4_ * 0.6931472;
                auVar26._0_4_ = auVar161._0_4_ * 0.6931472;
                auVar26._8_4_ = auVar161._8_4_ * 0.6931472;
                auVar26._12_4_ = auVar161._12_4_ * 0.6931472;
                auVar26._16_4_ = auVar161._16_4_ * 0.6931472;
                auVar26._20_4_ = auVar161._20_4_ * 0.6931472;
                auVar26._24_4_ = auVar161._24_4_ * 0.6931472;
                auVar26._28_4_ = auVar273._28_4_;
                auVar273 = vsubps_avx(auVar93,auVar26);
                fVar227 = auVar273._0_4_;
                fVar229 = auVar273._4_4_;
                fVar340 = auVar273._8_4_;
                fVar342 = auVar273._12_4_;
                fVar344 = auVar273._16_4_;
                fVar346 = auVar273._20_4_;
                fVar348 = auVar273._24_4_;
                auVar239._0_4_ = (int)auVar161._0_4_;
                auVar239._4_4_ = (int)auVar161._4_4_;
                auVar239._8_4_ = (int)auVar161._8_4_;
                auVar239._12_4_ = (int)auVar161._12_4_;
                auVar206._16_4_ = (int)auVar161._16_4_;
                auVar206._0_16_ = auVar239;
                auVar206._20_4_ = (int)auVar161._20_4_;
                auVar206._24_4_ = (int)auVar161._24_4_;
                auVar206._28_4_ = (int)auVar161._28_4_;
                auVar239 = vpslld_avx(auVar239,0x17);
                auVar171 = vpslld_avx(auVar206._16_16_,0x17);
                auVar106._8_4_ = 0x3f800000;
                auVar106._0_8_ = 0x3f8000003f800000;
                auVar106._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar239 = vpaddd_avx(auVar239,auVar106);
                auVar272._0_4_ =
                     (fVar227 + 1.0 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar85)) * auVar239._0_4_
                     + 1.0;
                auVar272._4_4_ =
                     (fVar229 + 1.0 +
                     fVar229 * fVar229 *
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar105)) * auVar239._4_4_
                     + 1.0;
                auVar272._8_4_ =
                     (fVar340 + 1.0 +
                     fVar340 * fVar340 *
                     (((((fVar340 * 0.00019875691 + 0.0013981999) * fVar340 + 0.008333452) * fVar340
                       + 0.041665796) * fVar340 + 0.16666666) * fVar340 + fVar122)) * auVar239._8_4_
                     + 1.0;
                auVar272._12_4_ =
                     (fVar342 + 1.0 +
                     fVar342 * fVar342 *
                     (((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) * fVar342
                       + 0.041665796) * fVar342 + 0.16666666) * fVar342 + fVar123)) *
                     auVar239._12_4_ + 1.0;
                auVar272._16_4_ =
                     (fVar344 + 1.0 +
                     fVar344 * fVar344 *
                     (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344
                       + 0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar231)) * auVar171._0_4_
                     + 1.0;
                auVar272._20_4_ =
                     (fVar346 + 1.0 +
                     fVar346 * fVar346 *
                     (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346
                       + 0.041665796) * fVar346 + 0.16666666) * fVar346 + fVar124)) * auVar171._4_4_
                     + 1.0;
                auVar272._24_4_ =
                     (fVar348 + 1.0 +
                     fVar348 * fVar348 *
                     (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348
                       + 0.041665796) * fVar348 + 0.16666666) * fVar348 + fVar228)) * auVar171._8_4_
                     + 1.0;
                auVar272._28_4_ =
                     auVar273._28_4_ + 1.0 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar230 + 1.0;
                auVar155._8_4_ = 0x800000;
                auVar155._0_8_ = 0x80000000800000;
                auVar155._12_4_ = 0x800000;
                auVar155._16_4_ = 0x800000;
                auVar155._20_4_ = 0x800000;
                auVar155._24_4_ = 0x800000;
                auVar155._28_4_ = 0x800000;
                auVar93 = vmaxps_avx(auVar272,auVar155);
                auVar171 = vpsrld_avx(auVar93._16_16_,0x17);
                auVar235._8_4_ = 0x807fffff;
                auVar235._0_8_ = 0x807fffff807fffff;
                auVar235._12_4_ = 0x807fffff;
                auVar235._16_4_ = 0x807fffff;
                auVar235._20_4_ = 0x807fffff;
                auVar235._24_4_ = 0x807fffff;
                auVar235._28_4_ = 0x807fffff;
                auVar161 = vandps_avx(auVar93,auVar235);
                auVar212 = vorps_avx(auVar161,auVar308._0_32_);
                auVar236._8_4_ = 0x3f3504f3;
                auVar236._0_8_ = 0x3f3504f33f3504f3;
                auVar236._12_4_ = 0x3f3504f3;
                auVar236._16_4_ = 0x3f3504f3;
                auVar236._20_4_ = 0x3f3504f3;
                auVar236._24_4_ = 0x3f3504f3;
                auVar236._28_4_ = 0x3f3504f3;
                auVar273 = vcmpps_avx(auVar236,auVar212,2);
                auVar161 = vandnps_avx(auVar273,auVar212);
                fVar227 = auVar212._0_4_ + -1.0 + auVar161._0_4_;
                fVar229 = auVar212._4_4_ + -1.0 + auVar161._4_4_;
                fVar340 = auVar212._8_4_ + -1.0 + auVar161._8_4_;
                fVar342 = auVar212._12_4_ + -1.0 + auVar161._12_4_;
                fVar344 = auVar212._16_4_ + -1.0 + auVar161._16_4_;
                fVar346 = auVar212._20_4_ + -1.0 + auVar161._20_4_;
                fVar348 = auVar212._24_4_ + -1.0 + auVar161._24_4_;
                auVar171 = vpsubd_avx(auVar171,auVar273._16_16_);
                auVar239 = vpsrld_avx(auVar93._0_16_,0x17);
                auVar295._8_4_ = 0xffffff81;
                auVar295._0_8_ = 0xffffff81ffffff81;
                auVar295._12_4_ = 0xffffff81;
                auVar171 = vpaddd_avx(auVar295,auVar171);
                auVar239 = vpsubd_avx(auVar239,auVar273._0_16_);
                auVar239 = vpaddd_avx(auVar295,auVar239);
                auVar156._16_16_ = auVar171;
                auVar156._0_16_ = auVar239;
                auVar273 = vcmpps_avx(auVar272,_DAT_00548840,2);
                auVar93 = vcvtdq2ps_avx(auVar156);
                auVar27._4_4_ =
                     (fVar229 + auVar93._4_4_ * 0.6931472 +
                     fVar229 * fVar229 *
                     (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (
                                                  fVar229 * (fVar229 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._0_4_ =
                     (fVar227 + auVar93._0_4_ * 0.6931472 +
                     fVar227 * fVar227 *
                     (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (
                                                  fVar227 * (fVar227 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._8_4_ =
                     (fVar340 + auVar93._8_4_ * 0.6931472 +
                     fVar340 * fVar340 *
                     (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * (fVar340 * (
                                                  fVar340 * (fVar340 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._12_4_ =
                     (fVar342 + auVar93._12_4_ * 0.6931472 +
                     fVar342 * fVar342 *
                     (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (
                                                  fVar342 * (fVar342 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._16_4_ =
                     (fVar344 + auVar93._16_4_ * 0.6931472 +
                     fVar344 * fVar344 *
                     (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * (
                                                  fVar344 * (fVar344 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._20_4_ =
                     (fVar346 + auVar93._20_4_ * 0.6931472 +
                     fVar346 * fVar346 *
                     (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (fVar346 * (
                                                  fVar346 * (fVar346 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._24_4_ =
                     (fVar348 + auVar93._24_4_ * 0.6931472 +
                     fVar348 * fVar348 *
                     (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * (
                                                  fVar348 * (fVar348 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar27._28_4_ = auVar212._28_4_ + -1.0 + auVar161._28_4_ + auVar93._28_4_ + 0.0;
                auVar207._8_4_ = 0x7fffffff;
                auVar207._0_8_ = 0x7fffffff7fffffff;
                auVar207._12_4_ = 0x7fffffff;
                auVar207._16_4_ = 0x7fffffff;
                auVar207._20_4_ = 0x7fffffff;
                auVar207._24_4_ = 0x7fffffff;
                auVar207._28_4_ = 0x7fffffff;
                auVar161 = vblendvps_avx(auVar27,auVar207,auVar273);
                auVar208._8_4_ = 0x42b0c0a5;
                auVar208._0_8_ = 0x42b0c0a542b0c0a5;
                auVar208._12_4_ = 0x42b0c0a5;
                auVar208._16_4_ = 0x42b0c0a5;
                auVar208._20_4_ = 0x42b0c0a5;
                auVar208._24_4_ = 0x42b0c0a5;
                auVar208._28_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar161,auVar208);
                auVar209._8_4_ = 0xc2b0c0a5;
                auVar209._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar209._12_4_ = 0xc2b0c0a5;
                auVar209._16_4_ = 0xc2b0c0a5;
                auVar209._20_4_ = 0xc2b0c0a5;
                auVar209._24_4_ = 0xc2b0c0a5;
                auVar209._28_4_ = 0xc2b0c0a5;
                auVar273 = vmaxps_avx(auVar161,auVar209);
                auVar210._0_4_ = auVar273._0_4_ * 1.442695 + fVar85;
                auVar210._4_4_ = auVar273._4_4_ * 1.442695 + fVar105;
                auVar210._8_4_ = auVar273._8_4_ * 1.442695 + fVar122;
                auVar210._12_4_ = auVar273._12_4_ * 1.442695 + fVar123;
                auVar210._16_4_ = auVar273._16_4_ * 1.442695 + fVar231;
                auVar210._20_4_ = auVar273._20_4_ * 1.442695 + fVar124;
                auVar210._24_4_ = auVar273._24_4_ * 1.442695 + fVar228;
                auVar210._28_4_ = fVar230 + -88.37626;
                auVar93 = vroundps_avx(auVar210,1);
                auVar161 = vcmpps_avx(auVar210,auVar93,1);
                auVar161 = vandps_avx(auVar161,auVar237);
                auVar161 = vsubps_avx(auVar93,auVar161);
                auVar28._4_4_ = auVar161._4_4_ * 0.6931472;
                auVar28._0_4_ = auVar161._0_4_ * 0.6931472;
                auVar28._8_4_ = auVar161._8_4_ * 0.6931472;
                auVar28._12_4_ = auVar161._12_4_ * 0.6931472;
                auVar28._16_4_ = auVar161._16_4_ * 0.6931472;
                auVar28._20_4_ = auVar161._20_4_ * 0.6931472;
                auVar28._24_4_ = auVar161._24_4_ * 0.6931472;
                auVar28._28_4_ = auVar93._28_4_;
                auVar26 = vsubps_avx(auVar273,auVar28);
                fVar227 = auVar26._0_4_;
                fVar229 = auVar26._4_4_;
                fVar340 = auVar26._8_4_;
                fVar342 = auVar26._12_4_;
                fVar344 = auVar26._16_4_;
                fVar346 = auVar26._20_4_;
                fVar348 = auVar26._24_4_;
                auVar104 = ZEXT864(0) << 0x20;
                auVar308 = ZEXT3264(auVar308._0_32_);
                auVar273._0_4_ =
                     fVar85 + ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) *
                                fVar227 + 0.041665796) * fVar227 + 0.16666666) * fVar227;
                auVar273._4_4_ =
                     fVar105 + ((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452)
                                 * fVar229 + 0.041665796) * fVar229 + 0.16666666) * fVar229;
                auVar273._8_4_ =
                     fVar122 + ((((fVar340 * 0.00019875691 + 0.0013981999) * fVar340 + 0.008333452)
                                 * fVar340 + 0.041665796) * fVar340 + 0.16666666) * fVar340;
                auVar273._12_4_ =
                     fVar123 + ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452)
                                 * fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342;
                auVar273._16_4_ =
                     fVar231 + ((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452)
                                 * fVar344 + 0.041665796) * fVar344 + 0.16666666) * fVar344;
                auVar273._20_4_ =
                     fVar124 + ((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452)
                                 * fVar346 + 0.041665796) * fVar346 + 0.16666666) * fVar346;
                auVar273._24_4_ =
                     fVar228 + ((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452)
                                 * fVar348 + 0.041665796) * fVar348 + 0.16666666) * fVar348;
                auVar273._28_4_ =
                     fVar230 + auVar272._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 +
                               0.16666666;
                auVar172._0_4_ = (int)auVar161._0_4_;
                auVar172._4_4_ = (int)auVar161._4_4_;
                auVar172._8_4_ = (int)auVar161._8_4_;
                auVar172._12_4_ = (int)auVar161._12_4_;
                auVar211._16_4_ = (int)auVar161._16_4_;
                auVar211._0_16_ = auVar172;
                auVar211._20_4_ = (int)auVar161._20_4_;
                auVar211._24_4_ = (int)auVar161._24_4_;
                auVar211._28_4_ = (int)auVar161._28_4_;
                auVar239 = vpslld_avx(auVar172,0x17);
                auVar171 = vpslld_avx(auVar211._16_16_,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar239 = vpaddd_avx(auVar239,auVar106);
                auVar212._16_16_ = auVar171;
                auVar212._0_16_ = auVar239;
                auVar157._0_4_ =
                     (fVar227 + 1.0 + fVar227 * fVar227 * auVar273._0_4_) * auVar239._0_4_ + 1.0;
                auVar157._4_4_ =
                     (fVar229 + 1.0 + fVar229 * fVar229 * auVar273._4_4_) * auVar239._4_4_ + 1.0;
                auVar157._8_4_ =
                     (fVar340 + 1.0 + fVar340 * fVar340 * auVar273._8_4_) * auVar239._8_4_ + 1.0;
                auVar157._12_4_ =
                     (fVar342 + 1.0 + fVar342 * fVar342 * auVar273._12_4_) * auVar239._12_4_ + 1.0;
                auVar157._16_4_ =
                     (fVar344 + 1.0 + fVar344 * fVar344 * auVar273._16_4_) * auVar171._0_4_ + 1.0;
                auVar157._20_4_ =
                     (fVar346 + 1.0 + fVar346 * fVar346 * auVar273._20_4_) * auVar171._4_4_ + 1.0;
                auVar157._24_4_ =
                     (fVar348 + 1.0 + fVar348 * fVar348 * auVar273._24_4_) * auVar171._8_4_ + 1.0;
                auVar157._28_4_ = auVar26._28_4_ + 1.0 + auVar93._28_4_ + 1.0;
                auVar93._8_4_ = 0x40000000;
                auVar93._0_8_ = 0x4000000040000000;
                auVar93._12_4_ = 0x40000000;
                auVar93._16_4_ = 0x40000000;
                auVar93._20_4_ = 0x40000000;
                auVar93._24_4_ = 0x40000000;
                auVar93._28_4_ = 0x40000000;
                auVar161 = vdivps_avx(auVar93,auVar157);
                auVar152._0_4_ = auVar161._0_4_ + -1.0;
                auVar152._4_4_ = auVar161._4_4_ + -1.0;
                auVar152._8_4_ = auVar161._8_4_ + -1.0;
                auVar152._12_4_ = auVar161._12_4_ + -1.0;
                auVar152._16_4_ = auVar161._16_4_ + -1.0;
                auVar152._20_4_ = auVar161._20_4_ + -1.0;
                auVar152._24_4_ = auVar161._24_4_ + -1.0;
                goto LAB_0027c130;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar212._4_4_ = fVar105;
                auVar212._0_4_ = fVar105;
                auVar212._8_4_ = fVar105;
                auVar212._12_4_ = fVar105;
                auVar212._16_4_ = fVar105;
                auVar212._20_4_ = fVar105;
                auVar212._24_4_ = fVar105;
                auVar212._28_4_ = fVar105;
                auVar161._0_4_ = auVar315._0_4_ * fVar85 + fVar105;
                auVar161._4_4_ = auVar315._4_4_ * fVar85 + fVar105;
                auVar161._8_4_ = fVar170 * fVar85 + fVar105;
                auVar161._12_4_ = fVar223 * fVar85 + fVar105;
                auVar161._16_4_ = fVar224 * fVar85 + fVar105;
                auVar161._20_4_ = fVar225 * fVar85 + fVar105;
                auVar161._24_4_ = fVar226 * fVar85 + fVar105;
                auVar161._28_4_ = fVar85 + fVar105;
                auVar161 = vmaxps_avx(auVar161,auVar93);
                auVar161 = vminps_avx(auVar161,auVar237);
                auVar152 = auVar161._0_28_;
LAB_0027c130:
                in_ZMM3 = ZEXT3264(auVar212);
                auVar37._4_4_ = auVar315._4_4_ * auVar152._4_4_;
                auVar37._0_4_ = auVar315._0_4_ * auVar152._0_4_;
                auVar37._8_4_ = fVar170 * auVar152._8_4_;
                auVar37._12_4_ = fVar223 * auVar152._12_4_;
                auVar37._16_4_ = fVar224 * auVar152._16_4_;
                auVar37._20_4_ = fVar225 * auVar152._20_4_;
                auVar37._24_4_ = fVar226 * auVar152._24_4_;
                auVar37._28_4_ = auVar273._28_4_;
                auVar273 = auVar37;
              }
              auVar161 = auVar273;
LAB_0027c138:
              *local_1e0 = auVar161;
              local_1e0 = local_1e0 + 1;
              iVar64 = iVar64 + 1;
            }
          }
        }
      }
      if ((iVar78 == 4) && (uVar59 == 8)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar80 = 0;
        if (0 < (int)uVar12) {
          uVar80 = (ulong)uVar12;
        }
        uVar58 = 0;
        uVar43 = local_198.c;
        if (local_198.c < 1) {
          uVar43 = 0;
        }
        auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar304 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar306 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar104 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar308 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar307 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        for (; uVar58 != uVar43; uVar58 = uVar58 + 1) {
          local_1e0 = (undefined1 (*) [32])
                      (local_198.cstep * uVar58 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar50 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar50 = 0;
          }
          uVar51 = 0;
          uVar77 = local_198.w;
          if (local_198.w < 1) {
            uVar77 = 0;
          }
          uVar55 = local_198.h;
          if (local_198.h < 1) {
            uVar55 = 0;
          }
          for (; uVar51 != uVar55; uVar51 = uVar51 + 1) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar70 = 0; uVar70 != uVar77; uVar70 = uVar70 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar316 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar316 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + uVar58 * 0x20));
              }
              pvVar83 = bottom_blob->data;
              lVar48 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar58 * (this->weight_data_tm).elemsize +
                       0x60;
              for (uVar75 = 0; uVar75 != uVar50; uVar75 = uVar75 + 1) {
                lVar62 = lVar48;
                for (uVar54 = 0; uVar54 != uVar80; uVar54 = uVar54 + 1) {
                  iVar42 = (((int)uVar54 - uVar12) + 1) * iVar56 + uVar51;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    lVar52 = (long)iVar60 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar75;
                    iVar42 = iVar64;
                    for (lVar65 = 0; uVar63 * 0x80 != lVar65; lVar65 = lVar65 + 0x80) {
                      if (((-1 < iVar42) && (iVar60 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar60 < iVar76)) {
                        lVar46 = (long)(iVar60 << 2);
                        fVar85 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52);
                        fVar105 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 4);
                        fVar122 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 8);
                        fVar123 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0xc);
                        pfVar72 = (float *)(lVar62 + -0x60 + lVar65);
                        pfVar1 = (float *)(lVar62 + -0x40 + lVar65);
                        pfVar2 = (float *)(lVar62 + -0x20 + lVar65);
                        fVar231 = fVar105 + fVar122;
                        pfVar66 = (float *)(lVar62 + lVar65);
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar231,CONCAT424(fVar123 * pfVar66[6],
                                                                       CONCAT420(fVar123 * pfVar66[5
                                                  ],CONCAT416(fVar123 * pfVar66[4],
                                                              CONCAT412(fVar123 * pfVar66[3],
                                                                        CONCAT48(fVar123 * pfVar66[2
                                                  ],CONCAT44(fVar123 * pfVar66[1],fVar123 * *pfVar66
                                                            ))))))));
                        auVar316 = ZEXT3264(CONCAT428(auVar316._28_4_ + fVar85 + fVar231 + fVar231,
                                                      CONCAT424(auVar316._24_4_ +
                                                                fVar85 * pfVar72[6] +
                                                                fVar105 * pfVar1[6] +
                                                                fVar122 * pfVar2[6] +
                                                                fVar123 * pfVar66[6],
                                                                CONCAT420(auVar316._20_4_ +
                                                                          fVar85 * pfVar72[5] +
                                                                          fVar105 * pfVar1[5] +
                                                                          fVar122 * pfVar2[5] +
                                                                          fVar123 * pfVar66[5],
                                                                          CONCAT416(auVar316._16_4_
                                                                                    + fVar85 * 
                                                  pfVar72[4] +
                                                  fVar105 * pfVar1[4] + fVar122 * pfVar2[4] +
                                                  fVar123 * pfVar66[4],
                                                  CONCAT412(auVar316._12_4_ + fVar85 * pfVar72[3] +
                                                            fVar105 * pfVar1[3] +
                                                            fVar122 * pfVar2[3] +
                                                            fVar123 * pfVar66[3],
                                                            CONCAT48(auVar316._8_4_ +
                                                                     fVar85 * pfVar72[2] +
                                                                     fVar105 * pfVar1[2] +
                                                                     fVar122 * pfVar2[2] +
                                                                     fVar123 * pfVar66[2],
                                                                     CONCAT44(auVar316._4_4_ +
                                                                              fVar85 * pfVar72[1] +
                                                                              fVar105 * pfVar1[1] +
                                                                              fVar122 * pfVar2[1] +
                                                                              fVar123 * pfVar66[1],
                                                                              auVar316._0_4_ +
                                                                              fVar85 * *pfVar72 +
                                                                              fVar105 * *pfVar1 +
                                                                              fVar122 * *pfVar2 +
                                                                              fVar123 * *pfVar66))))
                                                  ))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  lVar62 = lVar62 + (long)(int)uVar45 * 0x80;
                }
                lVar48 = lVar48 + (long)(int)(uVar45 * uVar12 * 0x20) * 4;
              }
              auVar237 = auVar316._0_32_;
              if (5 < iVar57 - 1U) goto LAB_0027c998;
              auVar273 = auVar315._0_32_;
              auVar281 = vmaxps_avx(auVar237,auVar273);
              fVar317 = auVar316._8_4_;
              fVar318 = auVar316._12_4_;
              fVar319 = auVar316._16_4_;
              fVar320 = auVar316._20_4_;
              fVar321 = auVar316._24_4_;
              fVar170 = auVar306._0_4_;
              fVar223 = auVar306._4_4_;
              fVar224 = auVar306._8_4_;
              fVar225 = auVar306._12_4_;
              fVar226 = auVar306._16_4_;
              fVar227 = auVar306._20_4_;
              fVar229 = auVar306._24_4_;
              auVar161 = auVar308._0_32_;
              fVar340 = auVar307._0_4_;
              fVar342 = auVar307._4_4_;
              fVar344 = auVar307._8_4_;
              fVar346 = auVar307._12_4_;
              fVar348 = auVar307._16_4_;
              fVar292 = auVar307._20_4_;
              fVar293 = auVar307._24_4_;
              fVar294 = auVar307._28_4_;
              auVar93 = auVar304._0_32_;
              fVar85 = auVar104._0_4_;
              fVar105 = auVar104._4_4_;
              fVar122 = auVar104._8_4_;
              fVar123 = auVar104._12_4_;
              fVar231 = auVar104._16_4_;
              fVar124 = auVar104._20_4_;
              fVar228 = auVar104._24_4_;
              fVar230 = auVar104._28_4_;
              switch(iVar57) {
              case 2:
                auVar237 = vminps_avx(auVar237,auVar273);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar277._0_4_ = fVar85 * auVar237._0_4_ + auVar281._0_4_;
                auVar277._4_4_ = fVar85 * auVar237._4_4_ + auVar281._4_4_;
                auVar277._8_4_ = fVar85 * auVar237._8_4_ + auVar281._8_4_;
                auVar277._12_4_ = fVar85 * auVar237._12_4_ + auVar281._12_4_;
                auVar277._16_4_ = fVar85 * auVar237._16_4_ + auVar281._16_4_;
                auVar277._20_4_ = fVar85 * auVar237._20_4_ + auVar281._20_4_;
                auVar277._24_4_ = fVar85 * auVar237._24_4_ + auVar281._24_4_;
                auVar277._28_4_ = auVar237._28_4_ + auVar281._28_4_;
                auVar281 = auVar277;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar282._4_4_ = uVar86;
                auVar282._0_4_ = uVar86;
                auVar282._8_4_ = uVar86;
                auVar282._12_4_ = uVar86;
                auVar282._16_4_ = uVar86;
                auVar282._20_4_ = uVar86;
                auVar282._24_4_ = uVar86;
                auVar282._28_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar337._4_4_ = uVar86;
                auVar337._0_4_ = uVar86;
                auVar337._8_4_ = uVar86;
                auVar337._12_4_ = uVar86;
                auVar337._16_4_ = uVar86;
                auVar337._20_4_ = uVar86;
                auVar337._24_4_ = uVar86;
                auVar337._28_4_ = uVar86;
                auVar237 = vmaxps_avx(auVar237,auVar282);
                auVar281 = vminps_avx(auVar337,auVar237);
                break;
              case 4:
                auVar283._0_8_ = auVar316._0_8_ ^ 0x8000000080000000;
                auVar283._8_4_ = -fVar317;
                auVar283._12_4_ = -fVar318;
                auVar283._16_4_ = -fVar319;
                auVar283._20_4_ = -fVar320;
                auVar283._24_4_ = -fVar321;
                auVar283._28_4_ = -auVar316._28_4_;
                auVar98._8_4_ = 0x42b0c0a5;
                auVar98._0_8_ = 0x42b0c0a542b0c0a5;
                auVar98._12_4_ = 0x42b0c0a5;
                auVar98._16_4_ = 0x42b0c0a5;
                auVar98._20_4_ = 0x42b0c0a5;
                auVar98._24_4_ = 0x42b0c0a5;
                auVar98._28_4_ = 0x42b0c0a5;
                auVar237 = vminps_avx(auVar283,auVar98);
                auVar273 = vmaxps_avx(auVar93,auVar237);
                auVar313._0_4_ = fVar170 * auVar273._0_4_ + fVar85;
                auVar313._4_4_ = fVar223 * auVar273._4_4_ + fVar105;
                auVar313._8_4_ = fVar224 * auVar273._8_4_ + fVar122;
                auVar313._12_4_ = fVar225 * auVar273._12_4_ + fVar123;
                auVar313._16_4_ = fVar226 * auVar273._16_4_ + fVar231;
                auVar313._20_4_ = fVar227 * auVar273._20_4_ + fVar124;
                auVar313._24_4_ = fVar229 * auVar273._24_4_ + fVar228;
                auVar313._28_4_ = auVar316._28_4_ + fVar230;
                auVar93 = vroundps_avx(auVar313,1);
                auVar237 = vcmpps_avx(auVar313,auVar93,1);
                auVar237 = vandps_avx(auVar237,auVar161);
                auVar237 = vsubps_avx(auVar93,auVar237);
                fVar170 = auVar237._0_4_ * -0.6931472 + auVar273._0_4_;
                fVar223 = auVar237._4_4_ * -0.6931472 + auVar273._4_4_;
                fVar224 = auVar237._8_4_ * -0.6931472 + auVar273._8_4_;
                fVar225 = auVar237._12_4_ * -0.6931472 + auVar273._12_4_;
                fVar226 = auVar237._16_4_ * -0.6931472 + auVar273._16_4_;
                fVar227 = auVar237._20_4_ * -0.6931472 + auVar273._20_4_;
                fVar229 = auVar237._24_4_ * -0.6931472 + auVar273._24_4_;
                auVar241._0_4_ = (int)auVar237._0_4_;
                auVar241._4_4_ = (int)auVar237._4_4_;
                auVar241._8_4_ = (int)auVar237._8_4_;
                auVar241._12_4_ = (int)auVar237._12_4_;
                auVar284._16_4_ = (int)auVar237._16_4_;
                auVar284._0_16_ = auVar241;
                auVar284._20_4_ = (int)auVar237._20_4_;
                auVar284._24_4_ = (int)auVar237._24_4_;
                auVar284._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar241,0x17);
                auVar171 = vpslld_avx(auVar284._16_16_,0x17);
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                in_ZMM3 = ZEXT1664(auVar175);
                auVar171 = vpaddd_avx(auVar171,auVar175);
                auVar239 = vpaddd_avx(auVar239,auVar175);
                auVar164._0_4_ =
                     (fVar170 + auVar308._0_4_ +
                     fVar170 * fVar170 *
                     ((((fVar340 + (fVar170 * 0.00019875691 + 0.0013981999) * fVar170) * fVar170 +
                       0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar85)) * auVar239._0_4_ +
                     auVar308._0_4_;
                auVar164._4_4_ =
                     (fVar223 + auVar308._4_4_ +
                     fVar223 * fVar223 *
                     ((((fVar342 + (fVar223 * 0.00019875691 + 0.0013981999) * fVar223) * fVar223 +
                       0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar105)) * auVar239._4_4_ +
                     auVar308._4_4_;
                auVar164._8_4_ =
                     (fVar224 + auVar308._8_4_ +
                     fVar224 * fVar224 *
                     ((((fVar344 + (fVar224 * 0.00019875691 + 0.0013981999) * fVar224) * fVar224 +
                       0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar122)) * auVar239._8_4_ +
                     auVar308._8_4_;
                auVar164._12_4_ =
                     (fVar225 + auVar308._12_4_ +
                     fVar225 * fVar225 *
                     ((((fVar346 + (fVar225 * 0.00019875691 + 0.0013981999) * fVar225) * fVar225 +
                       0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar123)) * auVar239._12_4_
                     + auVar308._12_4_;
                auVar164._16_4_ =
                     (fVar226 + auVar308._16_4_ +
                     fVar226 * fVar226 *
                     ((((fVar348 + (fVar226 * 0.00019875691 + 0.0013981999) * fVar226) * fVar226 +
                       0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231)) * auVar171._0_4_ +
                     auVar308._16_4_;
                auVar164._20_4_ =
                     (fVar227 + auVar308._20_4_ +
                     fVar227 * fVar227 *
                     ((((fVar292 + (fVar227 * 0.00019875691 + 0.0013981999) * fVar227) * fVar227 +
                       0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar124)) * auVar171._4_4_ +
                     auVar308._20_4_;
                auVar164._24_4_ =
                     (fVar229 + auVar308._24_4_ +
                     fVar229 * fVar229 *
                     ((((fVar293 + (fVar229 * 0.00019875691 + 0.0013981999) * fVar229) * fVar229 +
                       0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar228)) * auVar171._8_4_ +
                     auVar308._24_4_;
                auVar164._28_4_ =
                     auVar93._28_4_ + auVar273._28_4_ + auVar308._28_4_ +
                     fVar294 + -0.691749 + 0.041665796 + 0.16666666 + fVar230 + auVar308._28_4_;
                auVar281 = vdivps_avx(auVar161,auVar164);
                break;
              case 5:
                auVar301._8_4_ = 0x42b0c0a5;
                auVar301._0_8_ = 0x42b0c0a542b0c0a5;
                auVar301._12_4_ = 0x42b0c0a5;
                auVar301._16_4_ = 0x42b0c0a5;
                auVar301._20_4_ = 0x42b0c0a5;
                auVar301._24_4_ = 0x42b0c0a5;
                auVar301._28_4_ = 0x42b0c0a5;
                auVar237 = vminps_avx(auVar237,auVar301);
                auVar273 = vmaxps_avx(auVar93,auVar237);
                auVar278._0_4_ = fVar170 * auVar273._0_4_ + fVar85;
                auVar278._4_4_ = fVar223 * auVar273._4_4_ + fVar105;
                auVar278._8_4_ = fVar224 * auVar273._8_4_ + fVar122;
                auVar278._12_4_ = fVar225 * auVar273._12_4_ + fVar123;
                auVar278._16_4_ = fVar226 * auVar273._16_4_ + fVar231;
                auVar278._20_4_ = fVar227 * auVar273._20_4_ + fVar124;
                auVar278._24_4_ = fVar229 * auVar273._24_4_ + fVar228;
                auVar278._28_4_ = auVar281._28_4_ + fVar230;
                auVar212 = vroundps_avx(auVar278,1);
                auVar237 = vcmpps_avx(auVar278,auVar212,1);
                auVar237 = vandps_avx(auVar237,auVar161);
                auVar237 = vsubps_avx(auVar212,auVar237);
                auVar29._4_4_ = auVar237._4_4_ * 0.6931472;
                auVar29._0_4_ = auVar237._0_4_ * 0.6931472;
                auVar29._8_4_ = auVar237._8_4_ * 0.6931472;
                auVar29._12_4_ = auVar237._12_4_ * 0.6931472;
                auVar29._16_4_ = auVar237._16_4_ * 0.6931472;
                auVar29._20_4_ = auVar237._20_4_ * 0.6931472;
                auVar29._24_4_ = auVar237._24_4_ * 0.6931472;
                auVar29._28_4_ = auVar212._28_4_;
                auVar161 = vsubps_avx(auVar273,auVar29);
                fVar323 = auVar161._0_4_;
                fVar339 = auVar161._4_4_;
                fVar341 = auVar161._8_4_;
                fVar343 = auVar161._12_4_;
                fVar345 = auVar161._16_4_;
                fVar347 = auVar161._20_4_;
                fVar349 = auVar161._24_4_;
                auVar173._0_4_ = (int)auVar237._0_4_;
                auVar173._4_4_ = (int)auVar237._4_4_;
                auVar173._8_4_ = (int)auVar237._8_4_;
                auVar173._12_4_ = (int)auVar237._12_4_;
                auVar213._16_4_ = (int)auVar237._16_4_;
                auVar213._0_16_ = auVar173;
                auVar213._20_4_ = (int)auVar237._20_4_;
                auVar213._24_4_ = (int)auVar237._24_4_;
                auVar213._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar173,0x17);
                auVar171 = vpslld_avx(auVar213._16_16_,0x17);
                auVar87._8_4_ = 0x3f800000;
                auVar87._0_8_ = 0x3f8000003f800000;
                auVar87._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar87);
                auVar239 = vpaddd_avx(auVar239,auVar87);
                auVar279._0_4_ =
                     (fVar323 + 1.0 +
                     fVar323 * fVar323 *
                     ((((fVar340 + (fVar323 * 0.00019875691 + 0.0013981999) * fVar323) * fVar323 +
                       0.041665796) * fVar323 + 0.16666666) * fVar323 + fVar85)) * auVar239._0_4_ +
                     1.0;
                auVar279._4_4_ =
                     (fVar339 + 1.0 +
                     fVar339 * fVar339 *
                     ((((fVar342 + (fVar339 * 0.00019875691 + 0.0013981999) * fVar339) * fVar339 +
                       0.041665796) * fVar339 + 0.16666666) * fVar339 + fVar105)) * auVar239._4_4_ +
                     1.0;
                auVar279._8_4_ =
                     (fVar341 + 1.0 +
                     fVar341 * fVar341 *
                     ((((fVar344 + (fVar341 * 0.00019875691 + 0.0013981999) * fVar341) * fVar341 +
                       0.041665796) * fVar341 + 0.16666666) * fVar341 + fVar122)) * auVar239._8_4_ +
                     1.0;
                auVar279._12_4_ =
                     (fVar343 + 1.0 +
                     fVar343 * fVar343 *
                     ((((fVar346 + (fVar343 * 0.00019875691 + 0.0013981999) * fVar343) * fVar343 +
                       0.041665796) * fVar343 + 0.16666666) * fVar343 + fVar123)) * auVar239._12_4_
                     + 1.0;
                auVar279._16_4_ =
                     (fVar345 + 1.0 +
                     fVar345 * fVar345 *
                     ((((fVar348 + (fVar345 * 0.00019875691 + 0.0013981999) * fVar345) * fVar345 +
                       0.041665796) * fVar345 + 0.16666666) * fVar345 + fVar231)) * auVar171._0_4_ +
                     1.0;
                auVar279._20_4_ =
                     (fVar347 + 1.0 +
                     fVar347 * fVar347 *
                     ((((fVar292 + (fVar347 * 0.00019875691 + 0.0013981999) * fVar347) * fVar347 +
                       0.041665796) * fVar347 + 0.16666666) * fVar347 + fVar124)) * auVar171._4_4_ +
                     1.0;
                auVar279._24_4_ =
                     (fVar349 + 1.0 +
                     fVar349 * fVar349 *
                     ((((fVar293 + (fVar349 * 0.00019875691 + 0.0013981999) * fVar349) * fVar349 +
                       0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar228)) * auVar171._8_4_ +
                     1.0;
                auVar279._28_4_ =
                     auVar161._28_4_ + 1.0 +
                     fVar294 + in_ZMM3._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + fVar230 +
                     1.0;
                auVar94._8_4_ = 0x800000;
                auVar94._0_8_ = 0x80000000800000;
                auVar94._12_4_ = 0x800000;
                auVar94._16_4_ = 0x800000;
                auVar94._20_4_ = 0x800000;
                auVar94._24_4_ = 0x800000;
                auVar94._28_4_ = 0x800000;
                auVar273 = vmaxps_avx(auVar279,auVar94);
                auVar171 = vpsrld_avx(auVar273._16_16_,0x17);
                auVar95._8_4_ = 0x807fffff;
                auVar95._0_8_ = 0x807fffff807fffff;
                auVar95._12_4_ = 0x807fffff;
                auVar95._16_4_ = 0x807fffff;
                auVar95._20_4_ = 0x807fffff;
                auVar95._24_4_ = 0x807fffff;
                auVar95._28_4_ = 0x807fffff;
                auVar237 = vandps_avx(auVar273,auVar95);
                auVar212 = vorps_avx(auVar237,auVar104._0_32_);
                auVar96._8_4_ = 0x3f3504f3;
                auVar96._0_8_ = 0x3f3504f33f3504f3;
                auVar96._12_4_ = 0x3f3504f3;
                auVar96._16_4_ = 0x3f3504f3;
                auVar96._20_4_ = 0x3f3504f3;
                auVar96._24_4_ = 0x3f3504f3;
                auVar96._28_4_ = 0x3f3504f3;
                auVar161 = vcmpps_avx(auVar96,auVar212,2);
                auVar237 = vandnps_avx(auVar161,auVar212);
                fVar323 = auVar212._0_4_ + -1.0 + auVar237._0_4_;
                fVar339 = auVar212._4_4_ + -1.0 + auVar237._4_4_;
                fVar341 = auVar212._8_4_ + -1.0 + auVar237._8_4_;
                fVar343 = auVar212._12_4_ + -1.0 + auVar237._12_4_;
                fVar345 = auVar212._16_4_ + -1.0 + auVar237._16_4_;
                fVar347 = auVar212._20_4_ + -1.0 + auVar237._20_4_;
                fVar349 = auVar212._24_4_ + -1.0 + auVar237._24_4_;
                auVar171 = vpsubd_avx(auVar171,auVar161._16_16_);
                auVar239 = vpsrld_avx(auVar273._0_16_,0x17);
                auVar296._8_4_ = 0xffffff81;
                auVar296._0_8_ = 0xffffff81ffffff81;
                auVar296._12_4_ = 0xffffff81;
                auVar171 = vpaddd_avx(auVar296,auVar171);
                auVar239 = vpsubd_avx(auVar239,auVar161._0_16_);
                auVar239 = vpaddd_avx(auVar296,auVar239);
                auVar162._16_16_ = auVar171;
                auVar162._0_16_ = auVar239;
                auVar315 = ZEXT864(0) << 0x20;
                auVar161 = vcmpps_avx(auVar279,ZEXT832(0) << 0x20,2);
                auVar273 = vcvtdq2ps_avx(auVar162);
                auVar30._4_4_ =
                     (fVar339 + auVar273._4_4_ * 0.6931472 +
                     fVar339 * fVar339 *
                     (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * (
                                                  fVar339 * (fVar339 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._0_4_ =
                     (fVar323 + auVar273._0_4_ * 0.6931472 +
                     fVar323 * fVar323 *
                     (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * (fVar323 * (
                                                  fVar323 * (fVar323 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._8_4_ =
                     (fVar341 + auVar273._8_4_ * 0.6931472 +
                     fVar341 * fVar341 *
                     (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (fVar341 * (
                                                  fVar341 * (fVar341 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._12_4_ =
                     (fVar343 + auVar273._12_4_ * 0.6931472 +
                     fVar343 * fVar343 *
                     (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * (
                                                  fVar343 * (fVar343 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._16_4_ =
                     (fVar345 + auVar273._16_4_ * 0.6931472 +
                     fVar345 * fVar345 *
                     (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (fVar345 * (
                                                  fVar345 * (fVar345 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._20_4_ =
                     (fVar347 + auVar273._20_4_ * 0.6931472 +
                     fVar347 * fVar347 *
                     (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * (
                                                  fVar347 * (fVar347 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._24_4_ =
                     (fVar349 + auVar273._24_4_ * 0.6931472 +
                     fVar349 * fVar349 *
                     (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (fVar349 * (
                                                  fVar349 * (fVar349 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar30._28_4_ = auVar212._28_4_ + -1.0 + auVar237._28_4_ + auVar273._28_4_ + 0.0;
                auVar214._8_4_ = 0x7fffffff;
                auVar214._0_8_ = 0x7fffffff7fffffff;
                auVar214._12_4_ = 0x7fffffff;
                auVar214._16_4_ = 0x7fffffff;
                auVar214._20_4_ = 0x7fffffff;
                auVar214._24_4_ = 0x7fffffff;
                auVar214._28_4_ = 0x7fffffff;
                auVar237 = vblendvps_avx(auVar30,auVar214,auVar161);
                auVar237 = vminps_avx(auVar301,auVar237);
                auVar304 = ZEXT3264(auVar93);
                auVar161 = vmaxps_avx(auVar93,auVar237);
                auVar306 = ZEXT3264(auVar306._0_32_);
                auVar215._0_4_ = fVar170 * auVar161._0_4_ + fVar85;
                auVar215._4_4_ = fVar223 * auVar161._4_4_ + fVar105;
                auVar215._8_4_ = fVar224 * auVar161._8_4_ + fVar122;
                auVar215._12_4_ = fVar225 * auVar161._12_4_ + fVar123;
                auVar215._16_4_ = fVar226 * auVar161._16_4_ + fVar231;
                auVar215._20_4_ = fVar227 * auVar161._20_4_ + fVar124;
                auVar215._24_4_ = fVar229 * auVar161._24_4_ + fVar228;
                auVar215._28_4_ = fVar230 + NAN;
                auVar273 = vroundps_avx(auVar215,1);
                auVar237 = vcmpps_avx(auVar215,auVar273,1);
                auVar280._8_4_ = 0x3f800000;
                auVar280._0_8_ = 0x3f8000003f800000;
                auVar280._12_4_ = 0x3f800000;
                auVar280._16_4_ = 0x3f800000;
                auVar280._20_4_ = 0x3f800000;
                auVar280._24_4_ = 0x3f800000;
                auVar280._28_4_ = 0x3f800000;
                auVar237 = vandps_avx(auVar237,auVar280);
                auVar237 = vsubps_avx(auVar273,auVar237);
                auVar31._4_4_ = auVar237._4_4_ * 0.6931472;
                auVar31._0_4_ = auVar237._0_4_ * 0.6931472;
                auVar31._8_4_ = auVar237._8_4_ * 0.6931472;
                auVar31._12_4_ = auVar237._12_4_ * 0.6931472;
                auVar31._16_4_ = auVar237._16_4_ * 0.6931472;
                auVar31._20_4_ = auVar237._20_4_ * 0.6931472;
                auVar31._24_4_ = auVar237._24_4_ * 0.6931472;
                auVar31._28_4_ = auVar273._28_4_;
                auVar161 = vsubps_avx(auVar161,auVar31);
                fVar170 = auVar161._0_4_;
                fVar223 = auVar161._4_4_;
                fVar224 = auVar161._8_4_;
                fVar225 = auVar161._12_4_;
                fVar226 = auVar161._16_4_;
                fVar227 = auVar161._20_4_;
                fVar229 = auVar161._24_4_;
                auVar307 = ZEXT3264(auVar307._0_32_);
                auVar308 = ZEXT3264(CONCAT428(0x3f800000,
                                              CONCAT424(0x3f800000,
                                                        CONCAT420(0x3f800000,
                                                                  CONCAT416(0x3f800000,
                                                                            CONCAT412(0x3f800000,
                                                                                      CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                auVar104 = ZEXT3264(auVar104._0_32_);
                auVar281._0_4_ =
                     ((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + fVar340) * fVar170 +
                      0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar85;
                auVar281._4_4_ =
                     ((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + fVar342) * fVar223 +
                      0.041665796) * fVar223 + 0.16666666) * fVar223 + fVar105;
                auVar281._8_4_ =
                     ((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + fVar344) * fVar224 +
                      0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar122;
                auVar281._12_4_ =
                     ((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + fVar346) * fVar225 +
                      0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar123;
                auVar281._16_4_ =
                     ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + fVar348) * fVar226 +
                      0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231;
                auVar281._20_4_ =
                     ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + fVar292) * fVar227 +
                      0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar124;
                auVar281._24_4_ =
                     ((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + fVar293) * fVar229 +
                      0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar228;
                auVar281._28_4_ = fVar294 + 1.0013982 + 0.041665796 + 0.16666666 + fVar230;
                auVar174._0_4_ = (int)auVar237._0_4_;
                auVar174._4_4_ = (int)auVar237._4_4_;
                auVar174._8_4_ = (int)auVar237._8_4_;
                auVar174._12_4_ = (int)auVar237._12_4_;
                auVar216._16_4_ = (int)auVar237._16_4_;
                auVar216._0_16_ = auVar174;
                auVar216._20_4_ = (int)auVar237._20_4_;
                auVar216._24_4_ = (int)auVar237._24_4_;
                auVar216._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar174,0x17);
                auVar171 = vpslld_avx(auVar216._16_16_,0x17);
                auVar88._8_4_ = 0x3f800000;
                auVar88._0_8_ = 0x3f8000003f800000;
                auVar88._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar88);
                auVar239 = vpaddd_avx(auVar239,auVar88);
                auVar217._16_16_ = auVar171;
                auVar217._0_16_ = auVar239;
                auVar163._0_4_ =
                     (fVar170 + 1.0 + fVar170 * fVar170 * auVar281._0_4_) * auVar239._0_4_ + 1.0;
                auVar163._4_4_ =
                     (fVar223 + 1.0 + fVar223 * fVar223 * auVar281._4_4_) * auVar239._4_4_ + 1.0;
                auVar163._8_4_ =
                     (fVar224 + 1.0 + fVar224 * fVar224 * auVar281._8_4_) * auVar239._8_4_ + 1.0;
                auVar163._12_4_ =
                     (fVar225 + 1.0 + fVar225 * fVar225 * auVar281._12_4_) * auVar239._12_4_ + 1.0;
                auVar163._16_4_ =
                     (fVar226 + 1.0 + fVar226 * fVar226 * auVar281._16_4_) * auVar171._0_4_ + 1.0;
                auVar163._20_4_ =
                     (fVar227 + 1.0 + fVar227 * fVar227 * auVar281._20_4_) * auVar171._4_4_ + 1.0;
                auVar163._24_4_ =
                     (fVar229 + 1.0 + fVar229 * fVar229 * auVar281._24_4_) * auVar171._8_4_ + 1.0;
                auVar163._28_4_ = auVar161._28_4_ + 1.0 + auVar273._28_4_ + 1.0;
                auVar97._8_4_ = 0x40000000;
                auVar97._0_8_ = 0x4000000040000000;
                auVar97._12_4_ = 0x40000000;
                auVar97._16_4_ = 0x40000000;
                auVar97._20_4_ = 0x40000000;
                auVar97._24_4_ = 0x40000000;
                auVar97._28_4_ = 0x40000000;
                auVar237 = vdivps_avx(auVar97,auVar163);
                auVar153._0_4_ = auVar237._0_4_ + -1.0;
                auVar153._4_4_ = auVar237._4_4_ + -1.0;
                auVar153._8_4_ = auVar237._8_4_ + -1.0;
                auVar153._12_4_ = auVar237._12_4_ + -1.0;
                auVar153._16_4_ = auVar237._16_4_ + -1.0;
                auVar153._20_4_ = auVar237._20_4_ + -1.0;
                auVar153._24_4_ = auVar237._24_4_ + -1.0;
                goto LAB_0027c990;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar217._4_4_ = fVar105;
                auVar217._0_4_ = fVar105;
                auVar217._8_4_ = fVar105;
                auVar217._12_4_ = fVar105;
                auVar217._16_4_ = fVar105;
                auVar217._20_4_ = fVar105;
                auVar217._24_4_ = fVar105;
                auVar217._28_4_ = fVar105;
                auVar165._0_4_ = auVar316._0_4_ * fVar85 + fVar105;
                auVar165._4_4_ = auVar316._4_4_ * fVar85 + fVar105;
                auVar165._8_4_ = fVar317 * fVar85 + fVar105;
                auVar165._12_4_ = fVar318 * fVar85 + fVar105;
                auVar165._16_4_ = fVar319 * fVar85 + fVar105;
                auVar165._20_4_ = fVar320 * fVar85 + fVar105;
                auVar165._24_4_ = fVar321 * fVar85 + fVar105;
                auVar165._28_4_ = fVar85 + fVar105;
                auVar237 = vmaxps_avx(auVar273,auVar165);
                auVar237 = vminps_avx(auVar237,auVar161);
                auVar153 = auVar237._0_28_;
LAB_0027c990:
                in_ZMM3 = ZEXT3264(auVar217);
                auVar38._4_4_ = auVar316._4_4_ * auVar153._4_4_;
                auVar38._0_4_ = auVar316._0_4_ * auVar153._0_4_;
                auVar38._8_4_ = fVar317 * auVar153._8_4_;
                auVar38._12_4_ = fVar318 * auVar153._12_4_;
                auVar38._16_4_ = fVar319 * auVar153._16_4_;
                auVar38._20_4_ = fVar320 * auVar153._20_4_;
                auVar38._24_4_ = fVar321 * auVar153._24_4_;
                auVar38._28_4_ = auVar281._28_4_;
                auVar281 = auVar38;
              }
              auVar237 = auVar281;
LAB_0027c998:
              *local_1e0 = auVar237;
              local_1e0 = local_1e0 + 1;
              iVar64 = iVar64 + 1;
            }
          }
        }
      }
      if ((iVar78 == 8) && (uVar59 == 4)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar80 = 0;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        uVar75 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar75 = uVar80;
        }
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar315 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar308 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar80 != uVar75; uVar80 = uVar80 + 1) {
          local_240 = (undefined1 (*) [16])
                      (local_198.cstep * uVar80 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar79 = 0;
          uVar54 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar54 = uVar79;
          }
          uVar43 = local_198.w;
          if (local_198.w < 1) {
            uVar43 = 0;
          }
          uVar50 = local_198.h;
          if (local_198.h < 1) {
            uVar50 = 0;
          }
          while (uVar77 = (uint)uVar79, uVar77 != uVar50) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar51 = 0; uVar51 != uVar43; uVar51 = uVar51 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar304 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar304 = ZEXT1664(*(undefined1 (*) [16])((long)pvVar16 + uVar80 * 0x10));
              }
              pvVar83 = bottom_blob->data;
              lVar48 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar80 * (this->weight_data_tm).elemsize +
                       0x70;
              for (uVar79 = 0; uVar79 != uVar54; uVar79 = uVar79 + 1) {
                lVar62 = lVar48;
                for (uVar81 = 0; uVar81 != uVar58; uVar81 = uVar81 + 1) {
                  iVar42 = (((int)uVar81 - uVar12) + 1) * iVar56 + uVar77;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    lVar52 = (long)iVar60 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar79;
                    iVar42 = iVar64;
                    for (lVar65 = 0; uVar63 * 0x80 != lVar65; lVar65 = lVar65 + 0x80) {
                      if (((-1 < iVar42) && (iVar60 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar60 < iVar76)) {
                        lVar46 = (long)(iVar60 << 3);
                        fVar85 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52);
                        fVar105 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 4);
                        fVar122 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 8);
                        fVar123 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0xc);
                        fVar231 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x10);
                        fVar124 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x14);
                        fVar228 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x18);
                        fVar230 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0x1c);
                        pfVar72 = (float *)(lVar62 + -0x70 + lVar65);
                        pfVar1 = (float *)(lVar62 + -0x60 + lVar65);
                        pfVar2 = (float *)(lVar62 + -0x50 + lVar65);
                        pfVar3 = (float *)(lVar62 + -0x40 + lVar65);
                        pfVar4 = (float *)(lVar62 + -0x30 + lVar65);
                        pfVar5 = (float *)(lVar62 + -0x20 + lVar65);
                        pfVar6 = (float *)(lVar62 + -0x10 + lVar65);
                        pfVar66 = (float *)(lVar62 + lVar65);
                        in_ZMM3 = ZEXT1664(CONCAT412(fVar230 * pfVar66[3],
                                                     CONCAT48(fVar230 * pfVar66[2],
                                                              CONCAT44(fVar230 * pfVar66[1],
                                                                       fVar230 * *pfVar66))));
                        auVar304 = ZEXT1664(CONCAT412(fVar85 * pfVar72[3] + auVar304._12_4_ +
                                                      fVar105 * pfVar1[3] + fVar122 * pfVar2[3] +
                                                      fVar123 * pfVar3[3] + fVar231 * pfVar4[3] +
                                                      fVar124 * pfVar5[3] +
                                                      fVar228 * pfVar6[3] + fVar230 * pfVar66[3],
                                                      CONCAT48(fVar85 * pfVar72[2] + auVar304._8_4_
                                                               + fVar105 * pfVar1[2] +
                                                                 fVar122 * pfVar2[2] +
                                                               fVar123 * pfVar3[2] +
                                                               fVar231 * pfVar4[2] +
                                                               fVar124 * pfVar5[2] +
                                                               fVar228 * pfVar6[2] +
                                                               fVar230 * pfVar66[2],
                                                               CONCAT44(fVar85 * pfVar72[1] +
                                                                        auVar304._4_4_ +
                                                                        fVar105 * pfVar1[1] +
                                                                        fVar122 * pfVar2[1] +
                                                                        fVar123 * pfVar3[1] +
                                                                        fVar231 * pfVar4[1] +
                                                                        fVar124 * pfVar5[1] +
                                                                        fVar228 * pfVar6[1] +
                                                                        fVar230 * pfVar66[1],
                                                                        fVar85 * *pfVar72 +
                                                                        auVar304._0_4_ +
                                                                        fVar105 * *pfVar1 +
                                                                        fVar122 * *pfVar2 +
                                                                        fVar123 * *pfVar3 +
                                                                        fVar231 * *pfVar4 +
                                                                        fVar124 * *pfVar5 +
                                                                        fVar228 * *pfVar6 +
                                                                        fVar230 * *pfVar66))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  lVar62 = lVar62 + (long)(int)uVar45 * 0x80;
                }
                lVar48 = lVar48 + (long)(int)(uVar45 * uVar12 * 0x20) * 4;
              }
              auVar171 = auVar304._0_16_;
              auVar250 = auVar171;
              if (5 < iVar57 - 1U) goto switchD_0027cdbb_caseD_1;
              auVar239 = auVar104._0_16_;
              auVar250 = vmaxps_avx(auVar171,auVar239);
              auVar106 = auVar308._0_16_;
              fVar122 = auVar315._4_4_;
              fVar231 = auVar315._8_4_;
              fVar228 = auVar315._12_4_;
              fVar223 = auVar315._0_4_;
              fVar85 = auVar308._0_4_;
              fVar105 = auVar308._4_4_;
              fVar123 = auVar308._8_4_;
              fVar124 = auVar308._12_4_;
              fVar230 = auVar304._8_4_;
              fVar170 = auVar304._12_4_;
              switch(iVar57) {
              case 2:
                auVar171 = vminps_avx(auVar171,auVar239);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar242._0_4_ = fVar85 * auVar171._0_4_ + auVar250._0_4_;
                auVar242._4_4_ = fVar85 * auVar171._4_4_ + auVar250._4_4_;
                auVar242._8_4_ = fVar85 * auVar171._8_4_ + auVar250._8_4_;
                auVar242._12_4_ = fVar85 * auVar171._12_4_ + auVar250._12_4_;
                auVar250 = auVar242;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar247._4_4_ = uVar86;
                auVar247._0_4_ = uVar86;
                auVar247._8_4_ = uVar86;
                auVar247._12_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar326._4_4_ = uVar86;
                auVar326._0_4_ = uVar86;
                auVar326._8_4_ = uVar86;
                auVar326._12_4_ = uVar86;
                auVar171 = vmaxps_avx(auVar171,auVar247);
                auVar250 = vminps_avx(auVar326,auVar171);
                break;
              case 4:
                auVar108._0_8_ = auVar304._0_8_ ^ 0x8000000080000000;
                auVar108._8_4_ = -fVar230;
                auVar108._12_4_ = -fVar170;
                auVar129._8_4_ = 0x42b0c0a5;
                auVar129._0_8_ = 0x42b0c0a542b0c0a5;
                auVar129._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar108,auVar129);
                auVar130._8_4_ = 0xc2b0c0a5;
                auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar130._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar130);
                auVar248._0_4_ = fVar223 + auVar172._0_4_ * 1.442695;
                auVar248._4_4_ = fVar122 + auVar172._4_4_ * 1.442695;
                auVar248._8_4_ = fVar231 + auVar172._8_4_ * 1.442695;
                auVar248._12_4_ = fVar228 + auVar172._12_4_ * 1.442695;
                auVar327._0_4_ = (int)auVar248._0_4_;
                auVar327._4_4_ = (int)auVar248._4_4_;
                auVar327._8_4_ = (int)auVar248._8_4_;
                auVar327._12_4_ = (int)auVar248._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar327);
                auVar171 = vcmpps_avx(auVar248,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                fVar230 = auVar171._0_4_ * -0.6931472 + auVar172._0_4_;
                fVar170 = auVar171._4_4_ * -0.6931472 + auVar172._4_4_;
                fVar224 = auVar171._8_4_ * -0.6931472 + auVar172._8_4_;
                fVar225 = auVar171._12_4_ * -0.6931472 + auVar172._12_4_;
                auVar249._0_4_ = (int)auVar171._0_4_;
                auVar249._4_4_ = (int)auVar171._4_4_;
                auVar249._8_4_ = (int)auVar171._8_4_;
                auVar249._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar249,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar109._0_4_ =
                     (fVar230 * fVar230 *
                      (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                         fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar223) +
                     fVar230 + fVar85) * auVar171._0_4_ + fVar85;
                auVar109._4_4_ =
                     (fVar170 * fVar170 *
                      (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                         fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar122) +
                     fVar170 + fVar105) * auVar171._4_4_ + fVar105;
                auVar109._8_4_ =
                     (fVar224 * fVar224 *
                      (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) *
                         fVar224 + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar231) +
                     fVar224 + fVar123) * auVar171._8_4_ + fVar123;
                auVar109._12_4_ =
                     (fVar225 * fVar225 *
                      (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                         fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar228) +
                     fVar225 + fVar124) * auVar171._12_4_ + fVar124;
                auVar250 = vdivps_avx(auVar106,auVar109);
                break;
              case 5:
                auVar232._8_4_ = 0x42b0c0a5;
                auVar232._0_8_ = 0x42b0c0a542b0c0a5;
                auVar232._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar232);
                auVar297._8_4_ = 0xc2b0c0a5;
                auVar297._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar297._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar297,auVar171);
                auVar309._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar309._4_4_ = auVar172._4_4_ * 1.442695 + fVar122;
                auVar309._8_4_ = auVar172._8_4_ * 1.442695 + fVar231;
                auVar309._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar324._0_4_ = (int)auVar309._0_4_;
                auVar324._4_4_ = (int)auVar309._4_4_;
                auVar324._8_4_ = (int)auVar309._8_4_;
                auVar324._12_4_ = (int)auVar309._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar324);
                auVar171 = vcmpps_avx(auVar309,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar325._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar325._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar325._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar325._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar239 = vsubps_avx(auVar172,auVar325);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar243._0_4_ = (int)auVar171._0_4_;
                auVar243._4_4_ = (int)auVar171._4_4_;
                auVar243._8_4_ = (int)auVar171._8_4_;
                auVar243._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar243,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar244._0_4_ =
                     (fVar224 + fVar85 +
                     fVar224 * fVar224 *
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223)) * auVar171._0_4_
                     + fVar85;
                auVar244._4_4_ =
                     (fVar225 + fVar105 +
                     fVar225 * fVar225 *
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar122)) * auVar171._4_4_
                     + fVar105;
                auVar244._8_4_ =
                     (fVar226 + fVar123 +
                     fVar226 * fVar226 *
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231)) * auVar171._8_4_
                     + fVar123;
                auVar244._12_4_ =
                     (fVar227 + fVar124 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228)) *
                     auVar171._12_4_ + fVar124;
                auVar125._8_4_ = 0x800000;
                auVar125._0_8_ = 0x80000000800000;
                auVar125._12_4_ = 0x800000;
                auVar171 = vmaxps_avx(auVar244,auVar125);
                auVar239 = vpsrld_avx(auVar171,0x17);
                auVar176._8_4_ = 0xffffff82;
                auVar176._0_8_ = 0xffffff82ffffff82;
                auVar176._12_4_ = 0xffffff82;
                auVar239 = vpaddd_avx(auVar239,auVar176);
                auVar177._8_4_ = 0x807fffff;
                auVar177._0_8_ = 0x807fffff807fffff;
                auVar177._12_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar177);
                auVar295 = vorps_avx(auVar171,auVar315._0_16_);
                auVar172 = vcvtdq2ps_avx(auVar239);
                auVar178._8_4_ = 0x3f3504f3;
                auVar178._0_8_ = 0x3f3504f33f3504f3;
                auVar178._12_4_ = 0x3f3504f3;
                auVar239 = vcmpps_avx(auVar295,auVar178,1);
                auVar171 = vandps_avx(auVar239,auVar295);
                fVar224 = auVar295._0_4_ + -1.0 + auVar171._0_4_;
                fVar225 = auVar295._4_4_ + -1.0 + auVar171._4_4_;
                fVar226 = auVar295._8_4_ + -1.0 + auVar171._8_4_;
                fVar227 = auVar295._12_4_ + -1.0 + auVar171._12_4_;
                auVar171 = vandps_avx(auVar239,auVar106);
                auVar239 = vsubps_avx(auVar172,auVar171);
                auVar171 = vcmpps_avx(auVar244,_DAT_00545cc0,2);
                auVar126._0_4_ =
                     (fVar224 * fVar224 *
                      (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) *
                             fVar224 + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057)
                          * fVar224 + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) *
                       fVar224 + -0.5) + auVar239._0_4_ * 0.6931472 + fVar224) * -2.0;
                auVar126._4_4_ =
                     (fVar225 * fVar225 *
                      (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                             fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 + -0.16668057)
                          * fVar225 + 0.20000714) * fVar225 + -0.24999994) * fVar225 + 0.3333333) *
                       fVar225 + -0.5) + auVar239._4_4_ * 0.6931472 + fVar225) * -2.0;
                auVar126._8_4_ =
                     (fVar226 * fVar226 *
                      (((((((((fVar226 * 0.070376836 + -0.1151461) * fVar226 + 0.116769984) *
                             fVar226 + -0.12420141) * fVar226 + 0.14249323) * fVar226 + -0.16668057)
                          * fVar226 + 0.20000714) * fVar226 + -0.24999994) * fVar226 + 0.3333333) *
                       fVar226 + -0.5) + auVar239._8_4_ * 0.6931472 + fVar226) * -2.0;
                auVar126._12_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar239._12_4_ * 0.6931472 + fVar227) * -2.0;
                auVar179._8_4_ = 0x7fffffff;
                auVar179._0_8_ = 0x7fffffff7fffffff;
                auVar179._12_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar126,auVar179,auVar171);
                auVar180._8_4_ = 0x42b0c0a5;
                auVar180._0_8_ = 0x42b0c0a542b0c0a5;
                auVar180._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar180);
                auVar181._8_4_ = 0xc2b0c0a5;
                auVar181._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar181._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar181);
                auVar182._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar182._4_4_ = auVar172._4_4_ * 1.442695 + fVar122;
                auVar182._8_4_ = auVar172._8_4_ * 1.442695 + fVar231;
                auVar182._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar245._0_4_ = (int)auVar182._0_4_;
                auVar245._4_4_ = (int)auVar182._4_4_;
                auVar245._8_4_ = (int)auVar182._8_4_;
                auVar245._12_4_ = (int)auVar182._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar245);
                auVar171 = vcmpps_avx(auVar182,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar246._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar246._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar246._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar246._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar308 = ZEXT1664(auVar106);
                auVar239 = vsubps_avx(auVar172,auVar246);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar104 = ZEXT864(0) << 0x20;
                auVar315 = ZEXT1664(auVar315._0_16_);
                auVar183._0_4_ = (int)auVar171._0_4_;
                auVar183._4_4_ = (int)auVar171._4_4_;
                auVar183._8_4_ = (int)auVar171._8_4_;
                auVar183._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar183,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar127._0_4_ =
                     (fVar224 + fVar85 +
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223) *
                     fVar224 * fVar224) * auVar171._0_4_ + fVar85;
                auVar127._4_4_ =
                     (fVar225 + fVar105 +
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar122) *
                     fVar225 * fVar225) * auVar171._4_4_ + fVar105;
                auVar127._8_4_ =
                     (fVar226 + fVar123 +
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231) *
                     fVar226 * fVar226) * auVar171._8_4_ + fVar123;
                auVar127._12_4_ =
                     (fVar227 + fVar124 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228) *
                     fVar227 * fVar227) * auVar171._12_4_ + fVar124;
                auVar184._8_4_ = 0x40000000;
                auVar184._0_8_ = 0x4000000040000000;
                auVar184._12_4_ = 0x40000000;
                auVar171 = vdivps_avx(auVar184,auVar127);
                auVar128._0_4_ = auVar171._0_4_ + -1.0;
                auVar128._4_4_ = auVar171._4_4_ + -1.0;
                auVar128._8_4_ = auVar171._8_4_ + -1.0;
                auVar128._12_4_ = auVar171._12_4_ + -1.0;
                goto LAB_0027d1be;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar184._4_4_ = fVar105;
                auVar184._0_4_ = fVar105;
                auVar184._8_4_ = fVar105;
                auVar184._12_4_ = fVar105;
                auVar131._0_4_ = fVar85 * auVar304._0_4_ + fVar105;
                auVar131._4_4_ = fVar85 * auVar304._4_4_ + fVar105;
                auVar131._8_4_ = fVar85 * fVar230 + fVar105;
                auVar131._12_4_ = fVar85 * fVar170 + fVar105;
                auVar171 = vmaxps_avx(auVar131,auVar239);
                auVar128 = vminps_avx(auVar171,auVar106);
LAB_0027d1be:
                in_ZMM3 = ZEXT1664(auVar184);
                auVar250._0_4_ = auVar128._0_4_ * auVar304._0_4_;
                auVar250._4_4_ = auVar128._4_4_ * auVar304._4_4_;
                auVar250._8_4_ = auVar128._8_4_ * fVar230;
                auVar250._12_4_ = auVar128._12_4_ * fVar170;
              }
switchD_0027cdbb_caseD_1:
              *local_240 = auVar250;
              local_240 = local_240 + 1;
              iVar64 = iVar64 + 1;
            }
            uVar79 = (ulong)(uVar77 + 1);
          }
        }
      }
      if ((iVar78 == 1) && (uVar59 == 8)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar80 = 0;
        if (0 < (int)uVar12) {
          uVar80 = (ulong)uVar12;
        }
        uVar58 = 0;
        uVar43 = local_198.c;
        if (local_198.c < 1) {
          uVar43 = 0;
        }
        auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar304 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar306 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar104 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar308 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar307 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        for (; uVar58 != uVar43; uVar58 = uVar58 + 1) {
          local_1e0 = (undefined1 (*) [32])
                      (local_198.cstep * uVar58 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar50 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar50 = 0;
          }
          uVar51 = 0;
          uVar77 = local_198.w;
          if (local_198.w < 1) {
            uVar77 = 0;
          }
          uVar55 = local_198.h;
          if (local_198.h < 1) {
            uVar55 = 0;
          }
          for (; uVar51 != uVar55; uVar51 = uVar51 + 1) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar70 = 0; uVar70 != uVar77; uVar70 = uVar70 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar316 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar316 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + uVar58 * 0x20));
              }
              pvVar83 = (void *)((this->weight_data_tm).cstep * uVar58 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar75 = 0; uVar75 != uVar50; uVar75 = uVar75 + 1) {
                pvVar71 = pvVar83;
                for (uVar54 = 0; uVar54 != uVar80; uVar54 = uVar54 + 1) {
                  iVar42 = (((int)uVar54 - uVar12) + 1) * iVar56 + uVar51;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    iVar42 = iVar64;
                    for (lVar48 = 0; uVar63 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar44 < iVar76)) {
                        fVar85 = *(float *)((long)bottom_blob->data +
                                           (long)iVar44 * 4 +
                                           (long)iVar60 *
                                           (long)bottom_blob->w * bottom_blob->elemsize +
                                           bottom_blob->cstep * bottom_blob->elemsize * uVar75);
                        pfVar66 = (float *)((long)pvVar71 + lVar48);
                        auVar316 = ZEXT3264(CONCAT428(auVar316._28_4_ + fVar85,
                                                      CONCAT424(auVar316._24_4_ +
                                                                fVar85 * pfVar66[6],
                                                                CONCAT420(auVar316._20_4_ +
                                                                          fVar85 * pfVar66[5],
                                                                          CONCAT416(auVar316._16_4_
                                                                                    + fVar85 * 
                                                  pfVar66[4],
                                                  CONCAT412(auVar316._12_4_ + fVar85 * pfVar66[3],
                                                            CONCAT48(auVar316._8_4_ +
                                                                     fVar85 * pfVar66[2],
                                                                     CONCAT44(auVar316._4_4_ +
                                                                              fVar85 * pfVar66[1],
                                                                              auVar316._0_4_ +
                                                                              fVar85 * *pfVar66)))))
                                                  )));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  pvVar71 = (void *)((long)pvVar71 + (long)(int)uVar45 * 0x20);
                }
                pvVar83 = (void *)((long)pvVar83 + (long)(int)(uVar45 * uVar12 * 8) * 4);
              }
              auVar237 = auVar316._0_32_;
              if (5 < iVar57 - 1U) goto LAB_0027d9cb;
              auVar273 = auVar315._0_32_;
              auVar288 = vmaxps_avx(auVar237,auVar273);
              fVar343 = auVar316._8_4_;
              fVar345 = auVar316._12_4_;
              fVar347 = auVar316._16_4_;
              fVar349 = auVar316._20_4_;
              fVar322 = auVar316._24_4_;
              fVar342 = auVar306._0_4_;
              fVar344 = auVar306._4_4_;
              fVar346 = auVar306._8_4_;
              fVar348 = auVar306._12_4_;
              fVar292 = auVar306._16_4_;
              fVar293 = auVar306._20_4_;
              fVar294 = auVar306._24_4_;
              auVar161 = auVar308._0_32_;
              fVar317 = auVar307._0_4_;
              fVar318 = auVar307._4_4_;
              fVar319 = auVar307._8_4_;
              fVar320 = auVar307._12_4_;
              fVar321 = auVar307._16_4_;
              fVar323 = auVar307._20_4_;
              fVar339 = auVar307._24_4_;
              fVar341 = auVar307._28_4_;
              auVar93 = auVar304._0_32_;
              fVar85 = auVar104._0_4_;
              fVar122 = auVar104._4_4_;
              fVar124 = auVar104._8_4_;
              fVar230 = auVar104._12_4_;
              fVar223 = auVar104._16_4_;
              fVar224 = auVar104._20_4_;
              fVar227 = auVar104._24_4_;
              fVar340 = auVar104._28_4_;
              fVar105 = auVar308._0_4_;
              fVar123 = auVar308._4_4_;
              fVar231 = auVar308._8_4_;
              fVar228 = auVar308._12_4_;
              fVar170 = auVar308._16_4_;
              fVar225 = auVar308._20_4_;
              fVar226 = auVar308._24_4_;
              fVar229 = auVar308._28_4_;
              switch(iVar57) {
              case 2:
                auVar237 = vminps_avx(auVar237,auVar273);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar285._0_4_ = fVar85 * auVar237._0_4_ + auVar288._0_4_;
                auVar285._4_4_ = fVar85 * auVar237._4_4_ + auVar288._4_4_;
                auVar285._8_4_ = fVar85 * auVar237._8_4_ + auVar288._8_4_;
                auVar285._12_4_ = fVar85 * auVar237._12_4_ + auVar288._12_4_;
                auVar285._16_4_ = fVar85 * auVar237._16_4_ + auVar288._16_4_;
                auVar285._20_4_ = fVar85 * auVar237._20_4_ + auVar288._20_4_;
                auVar285._24_4_ = fVar85 * auVar237._24_4_ + auVar288._24_4_;
                auVar285._28_4_ = auVar237._28_4_ + auVar288._28_4_;
                auVar288 = auVar285;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar289._4_4_ = uVar86;
                auVar289._0_4_ = uVar86;
                auVar289._8_4_ = uVar86;
                auVar289._12_4_ = uVar86;
                auVar289._16_4_ = uVar86;
                auVar289._20_4_ = uVar86;
                auVar289._24_4_ = uVar86;
                auVar289._28_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar338._4_4_ = uVar86;
                auVar338._0_4_ = uVar86;
                auVar338._8_4_ = uVar86;
                auVar338._12_4_ = uVar86;
                auVar338._16_4_ = uVar86;
                auVar338._20_4_ = uVar86;
                auVar338._24_4_ = uVar86;
                auVar338._28_4_ = uVar86;
                auVar237 = vmaxps_avx(auVar237,auVar289);
                auVar288 = vminps_avx(auVar338,auVar237);
                break;
              case 4:
                auVar290._0_8_ = auVar316._0_8_ ^ 0x8000000080000000;
                auVar290._8_4_ = -fVar343;
                auVar290._12_4_ = -fVar345;
                auVar290._16_4_ = -fVar347;
                auVar290._20_4_ = -fVar349;
                auVar290._24_4_ = -fVar322;
                auVar290._28_4_ = -auVar316._28_4_;
                auVar103._8_4_ = 0x42b0c0a5;
                auVar103._0_8_ = 0x42b0c0a542b0c0a5;
                auVar103._12_4_ = 0x42b0c0a5;
                auVar103._16_4_ = 0x42b0c0a5;
                auVar103._20_4_ = 0x42b0c0a5;
                auVar103._24_4_ = 0x42b0c0a5;
                auVar103._28_4_ = 0x42b0c0a5;
                auVar237 = vminps_avx(auVar290,auVar103);
                auVar273 = vmaxps_avx(auVar93,auVar237);
                auVar314._0_4_ = fVar342 * auVar273._0_4_ + fVar85;
                auVar314._4_4_ = fVar344 * auVar273._4_4_ + fVar122;
                auVar314._8_4_ = fVar346 * auVar273._8_4_ + fVar124;
                auVar314._12_4_ = fVar348 * auVar273._12_4_ + fVar230;
                auVar314._16_4_ = fVar292 * auVar273._16_4_ + fVar223;
                auVar314._20_4_ = fVar293 * auVar273._20_4_ + fVar224;
                auVar314._24_4_ = fVar294 * auVar273._24_4_ + fVar227;
                auVar314._28_4_ = auVar316._28_4_ + fVar340;
                auVar93 = vroundps_avx(auVar314,1);
                auVar237 = vcmpps_avx(auVar314,auVar93,1);
                auVar237 = vandps_avx(auVar237,auVar161);
                auVar237 = vsubps_avx(auVar93,auVar237);
                fVar342 = auVar237._0_4_ * -0.6931472 + auVar273._0_4_;
                fVar344 = auVar237._4_4_ * -0.6931472 + auVar273._4_4_;
                fVar346 = auVar237._8_4_ * -0.6931472 + auVar273._8_4_;
                fVar348 = auVar237._12_4_ * -0.6931472 + auVar273._12_4_;
                fVar292 = auVar237._16_4_ * -0.6931472 + auVar273._16_4_;
                fVar293 = auVar237._20_4_ * -0.6931472 + auVar273._20_4_;
                fVar294 = auVar237._24_4_ * -0.6931472 + auVar273._24_4_;
                auVar251._0_4_ = (int)auVar237._0_4_;
                auVar251._4_4_ = (int)auVar237._4_4_;
                auVar251._8_4_ = (int)auVar237._8_4_;
                auVar251._12_4_ = (int)auVar237._12_4_;
                auVar291._16_4_ = (int)auVar237._16_4_;
                auVar291._0_16_ = auVar251;
                auVar291._20_4_ = (int)auVar237._20_4_;
                auVar291._24_4_ = (int)auVar237._24_4_;
                auVar291._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar251,0x17);
                auVar171 = vpslld_avx(auVar291._16_16_,0x17);
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = 0x3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                in_ZMM3 = ZEXT1664(auVar187);
                auVar171 = vpaddd_avx(auVar171,auVar187);
                auVar239 = vpaddd_avx(auVar239,auVar187);
                auVar168._0_4_ =
                     (fVar342 + fVar105 +
                     fVar342 * fVar342 *
                     ((((fVar317 + (fVar342 * 0.00019875691 + 0.0013981999) * fVar342) * fVar342 +
                       0.041665796) * fVar342 + 0.16666666) * fVar342 + fVar85)) * auVar239._0_4_ +
                     fVar105;
                auVar168._4_4_ =
                     (fVar344 + fVar123 +
                     fVar344 * fVar344 *
                     ((((fVar318 + (fVar344 * 0.00019875691 + 0.0013981999) * fVar344) * fVar344 +
                       0.041665796) * fVar344 + 0.16666666) * fVar344 + fVar122)) * auVar239._4_4_ +
                     fVar123;
                auVar168._8_4_ =
                     (fVar346 + fVar231 +
                     fVar346 * fVar346 *
                     ((((fVar319 + (fVar346 * 0.00019875691 + 0.0013981999) * fVar346) * fVar346 +
                       0.041665796) * fVar346 + 0.16666666) * fVar346 + fVar124)) * auVar239._8_4_ +
                     fVar231;
                auVar168._12_4_ =
                     (fVar348 + fVar228 +
                     fVar348 * fVar348 *
                     ((((fVar320 + (fVar348 * 0.00019875691 + 0.0013981999) * fVar348) * fVar348 +
                       0.041665796) * fVar348 + 0.16666666) * fVar348 + fVar230)) * auVar239._12_4_
                     + fVar228;
                auVar168._16_4_ =
                     (fVar292 + fVar170 +
                     fVar292 * fVar292 *
                     ((((fVar321 + (fVar292 * 0.00019875691 + 0.0013981999) * fVar292) * fVar292 +
                       0.041665796) * fVar292 + 0.16666666) * fVar292 + fVar223)) * auVar171._0_4_ +
                     fVar170;
                auVar168._20_4_ =
                     (fVar293 + fVar225 +
                     fVar293 * fVar293 *
                     ((((fVar323 + (fVar293 * 0.00019875691 + 0.0013981999) * fVar293) * fVar293 +
                       0.041665796) * fVar293 + 0.16666666) * fVar293 + fVar224)) * auVar171._4_4_ +
                     fVar225;
                auVar168._24_4_ =
                     (fVar294 + fVar226 +
                     fVar294 * fVar294 *
                     ((((fVar339 + (fVar294 * 0.00019875691 + 0.0013981999) * fVar294) * fVar294 +
                       0.041665796) * fVar294 + 0.16666666) * fVar294 + fVar227)) * auVar171._8_4_ +
                     fVar226;
                auVar168._28_4_ =
                     auVar93._28_4_ + auVar273._28_4_ + fVar229 +
                     fVar341 + -0.691749 + 0.041665796 + 0.16666666 + fVar340 + fVar229;
                auVar288 = vdivps_avx(auVar161,auVar168);
                break;
              case 5:
                auVar302._8_4_ = 0x42b0c0a5;
                auVar302._0_8_ = 0x42b0c0a542b0c0a5;
                auVar302._12_4_ = 0x42b0c0a5;
                auVar302._16_4_ = 0x42b0c0a5;
                auVar302._20_4_ = 0x42b0c0a5;
                auVar302._24_4_ = 0x42b0c0a5;
                auVar302._28_4_ = 0x42b0c0a5;
                auVar237 = vminps_avx(auVar237,auVar302);
                auVar273 = vmaxps_avx(auVar93,auVar237);
                auVar286._0_4_ = fVar342 * auVar273._0_4_ + fVar85;
                auVar286._4_4_ = fVar344 * auVar273._4_4_ + fVar122;
                auVar286._8_4_ = fVar346 * auVar273._8_4_ + fVar124;
                auVar286._12_4_ = fVar348 * auVar273._12_4_ + fVar230;
                auVar286._16_4_ = fVar292 * auVar273._16_4_ + fVar223;
                auVar286._20_4_ = fVar293 * auVar273._20_4_ + fVar224;
                auVar286._24_4_ = fVar294 * auVar273._24_4_ + fVar227;
                auVar286._28_4_ = auVar288._28_4_ + fVar340;
                auVar212 = vroundps_avx(auVar286,1);
                auVar237 = vcmpps_avx(auVar286,auVar212,1);
                auVar237 = vandps_avx(auVar237,auVar161);
                auVar237 = vsubps_avx(auVar212,auVar237);
                auVar32._4_4_ = auVar237._4_4_ * 0.6931472;
                auVar32._0_4_ = auVar237._0_4_ * 0.6931472;
                auVar32._8_4_ = auVar237._8_4_ * 0.6931472;
                auVar32._12_4_ = auVar237._12_4_ * 0.6931472;
                auVar32._16_4_ = auVar237._16_4_ * 0.6931472;
                auVar32._20_4_ = auVar237._20_4_ * 0.6931472;
                auVar32._24_4_ = auVar237._24_4_ * 0.6931472;
                auVar32._28_4_ = auVar212._28_4_;
                auVar161 = vsubps_avx(auVar273,auVar32);
                fVar19 = auVar161._0_4_;
                fVar20 = auVar161._4_4_;
                fVar21 = auVar161._8_4_;
                fVar22 = auVar161._12_4_;
                fVar23 = auVar161._16_4_;
                fVar24 = auVar161._20_4_;
                fVar25 = auVar161._24_4_;
                auVar185._0_4_ = (int)auVar237._0_4_;
                auVar185._4_4_ = (int)auVar237._4_4_;
                auVar185._8_4_ = (int)auVar237._8_4_;
                auVar185._12_4_ = (int)auVar237._12_4_;
                auVar218._16_4_ = (int)auVar237._16_4_;
                auVar218._0_16_ = auVar185;
                auVar218._20_4_ = (int)auVar237._20_4_;
                auVar218._24_4_ = (int)auVar237._24_4_;
                auVar218._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar185,0x17);
                auVar171 = vpslld_avx(auVar218._16_16_,0x17);
                auVar89._8_4_ = 0x3f800000;
                auVar89._0_8_ = 0x3f8000003f800000;
                auVar89._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar89);
                auVar239 = vpaddd_avx(auVar239,auVar89);
                auVar287._0_4_ =
                     (fVar19 + fVar105 +
                     fVar19 * fVar19 *
                     ((((fVar317 + (fVar19 * 0.00019875691 + 0.0013981999) * fVar19) * fVar19 +
                       0.041665796) * fVar19 + 0.16666666) * fVar19 + fVar85)) * auVar239._0_4_ +
                     fVar105;
                auVar287._4_4_ =
                     (fVar20 + fVar123 +
                     fVar20 * fVar20 *
                     ((((fVar318 + (fVar20 * 0.00019875691 + 0.0013981999) * fVar20) * fVar20 +
                       0.041665796) * fVar20 + 0.16666666) * fVar20 + fVar122)) * auVar239._4_4_ +
                     fVar123;
                auVar287._8_4_ =
                     (fVar21 + fVar231 +
                     fVar21 * fVar21 *
                     ((((fVar319 + (fVar21 * 0.00019875691 + 0.0013981999) * fVar21) * fVar21 +
                       0.041665796) * fVar21 + 0.16666666) * fVar21 + fVar124)) * auVar239._8_4_ +
                     fVar231;
                auVar287._12_4_ =
                     (fVar22 + fVar228 +
                     fVar22 * fVar22 *
                     ((((fVar320 + (fVar22 * 0.00019875691 + 0.0013981999) * fVar22) * fVar22 +
                       0.041665796) * fVar22 + 0.16666666) * fVar22 + fVar230)) * auVar239._12_4_ +
                     fVar228;
                auVar287._16_4_ =
                     (fVar23 + fVar170 +
                     fVar23 * fVar23 *
                     ((((fVar321 + (fVar23 * 0.00019875691 + 0.0013981999) * fVar23) * fVar23 +
                       0.041665796) * fVar23 + 0.16666666) * fVar23 + fVar223)) * auVar171._0_4_ +
                     fVar170;
                auVar287._20_4_ =
                     (fVar24 + fVar225 +
                     fVar24 * fVar24 *
                     ((((fVar323 + (fVar24 * 0.00019875691 + 0.0013981999) * fVar24) * fVar24 +
                       0.041665796) * fVar24 + 0.16666666) * fVar24 + fVar224)) * auVar171._4_4_ +
                     fVar225;
                auVar287._24_4_ =
                     (fVar25 + fVar226 +
                     fVar25 * fVar25 *
                     ((((fVar339 + (fVar25 * 0.00019875691 + 0.0013981999) * fVar25) * fVar25 +
                       0.041665796) * fVar25 + 0.16666666) * fVar25 + fVar227)) * auVar171._8_4_ +
                     fVar226;
                auVar287._28_4_ =
                     auVar161._28_4_ + fVar229 +
                     fVar341 + in_ZMM3._28_4_ + 0.0013981999 + 0.041665796 + 0.16666666 + fVar340 +
                     fVar229;
                auVar99._8_4_ = 0x800000;
                auVar99._0_8_ = 0x80000000800000;
                auVar99._12_4_ = 0x800000;
                auVar99._16_4_ = 0x800000;
                auVar99._20_4_ = 0x800000;
                auVar99._24_4_ = 0x800000;
                auVar99._28_4_ = 0x800000;
                auVar273 = vmaxps_avx(auVar287,auVar99);
                auVar171 = vpsrld_avx(auVar273._16_16_,0x17);
                auVar100._8_4_ = 0x807fffff;
                auVar100._0_8_ = 0x807fffff807fffff;
                auVar100._12_4_ = 0x807fffff;
                auVar100._16_4_ = 0x807fffff;
                auVar100._20_4_ = 0x807fffff;
                auVar100._24_4_ = 0x807fffff;
                auVar100._28_4_ = 0x807fffff;
                auVar237 = vandps_avx(auVar273,auVar100);
                auVar212 = vorps_avx(auVar237,auVar104._0_32_);
                auVar101._8_4_ = 0x3f3504f3;
                auVar101._0_8_ = 0x3f3504f33f3504f3;
                auVar101._12_4_ = 0x3f3504f3;
                auVar101._16_4_ = 0x3f3504f3;
                auVar101._20_4_ = 0x3f3504f3;
                auVar101._24_4_ = 0x3f3504f3;
                auVar101._28_4_ = 0x3f3504f3;
                auVar161 = vcmpps_avx(auVar101,auVar212,2);
                auVar237 = vandnps_avx(auVar161,auVar212);
                fVar105 = auVar212._0_4_ + -1.0 + auVar237._0_4_;
                fVar123 = auVar212._4_4_ + -1.0 + auVar237._4_4_;
                fVar231 = auVar212._8_4_ + -1.0 + auVar237._8_4_;
                fVar228 = auVar212._12_4_ + -1.0 + auVar237._12_4_;
                fVar170 = auVar212._16_4_ + -1.0 + auVar237._16_4_;
                fVar225 = auVar212._20_4_ + -1.0 + auVar237._20_4_;
                fVar226 = auVar212._24_4_ + -1.0 + auVar237._24_4_;
                auVar171 = vpsubd_avx(auVar171,auVar161._16_16_);
                auVar239 = vpsrld_avx(auVar273._0_16_,0x17);
                auVar298._8_4_ = 0xffffff81;
                auVar298._0_8_ = 0xffffff81ffffff81;
                auVar298._12_4_ = 0xffffff81;
                auVar171 = vpaddd_avx(auVar298,auVar171);
                auVar239 = vpsubd_avx(auVar239,auVar161._0_16_);
                auVar239 = vpaddd_avx(auVar298,auVar239);
                auVar166._16_16_ = auVar171;
                auVar166._0_16_ = auVar239;
                auVar315 = ZEXT864(0) << 0x20;
                auVar161 = vcmpps_avx(auVar287,_DAT_00548840,2);
                auVar273 = vcvtdq2ps_avx(auVar166);
                auVar33._4_4_ =
                     (fVar123 + auVar273._4_4_ * 0.6931472 +
                     fVar123 * fVar123 *
                     (fVar123 * (fVar123 * (fVar123 * (fVar123 * (fVar123 * (fVar123 * (fVar123 * (
                                                  fVar123 * (fVar123 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._0_4_ =
                     (fVar105 + auVar273._0_4_ * 0.6931472 +
                     fVar105 * fVar105 *
                     (fVar105 * (fVar105 * (fVar105 * (fVar105 * (fVar105 * (fVar105 * (fVar105 * (
                                                  fVar105 * (fVar105 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._8_4_ =
                     (fVar231 + auVar273._8_4_ * 0.6931472 +
                     fVar231 * fVar231 *
                     (fVar231 * (fVar231 * (fVar231 * (fVar231 * (fVar231 * (fVar231 * (fVar231 * (
                                                  fVar231 * (fVar231 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._12_4_ =
                     (fVar228 + auVar273._12_4_ * 0.6931472 +
                     fVar228 * fVar228 *
                     (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (
                                                  fVar228 * (fVar228 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._16_4_ =
                     (fVar170 + auVar273._16_4_ * 0.6931472 +
                     fVar170 * fVar170 *
                     (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (fVar170 * (
                                                  fVar170 * (fVar170 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._20_4_ =
                     (fVar225 + auVar273._20_4_ * 0.6931472 +
                     fVar225 * fVar225 *
                     (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (
                                                  fVar225 * (fVar225 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._24_4_ =
                     (fVar226 + auVar273._24_4_ * 0.6931472 +
                     fVar226 * fVar226 *
                     (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (
                                                  fVar226 * (fVar226 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar33._28_4_ = auVar212._28_4_ + -1.0 + auVar237._28_4_ + auVar273._28_4_ + 0.0;
                auVar219._8_4_ = 0x7fffffff;
                auVar219._0_8_ = 0x7fffffff7fffffff;
                auVar219._12_4_ = 0x7fffffff;
                auVar219._16_4_ = 0x7fffffff;
                auVar219._20_4_ = 0x7fffffff;
                auVar219._24_4_ = 0x7fffffff;
                auVar219._28_4_ = 0x7fffffff;
                auVar237 = vblendvps_avx(auVar33,auVar219,auVar161);
                auVar237 = vminps_avx(auVar302,auVar237);
                auVar304 = ZEXT3264(auVar93);
                auVar161 = vmaxps_avx(auVar93,auVar237);
                auVar306 = ZEXT3264(auVar306._0_32_);
                auVar220._0_4_ = fVar342 * auVar161._0_4_ + fVar85;
                auVar220._4_4_ = fVar344 * auVar161._4_4_ + fVar122;
                auVar220._8_4_ = fVar346 * auVar161._8_4_ + fVar124;
                auVar220._12_4_ = fVar348 * auVar161._12_4_ + fVar230;
                auVar220._16_4_ = fVar292 * auVar161._16_4_ + fVar223;
                auVar220._20_4_ = fVar293 * auVar161._20_4_ + fVar224;
                auVar220._24_4_ = fVar294 * auVar161._24_4_ + fVar227;
                auVar220._28_4_ = fVar340 + NAN;
                auVar273 = vroundps_avx(auVar220,1);
                auVar237 = vcmpps_avx(auVar220,auVar273,1);
                auVar238._8_4_ = 0x3f800000;
                auVar238._0_8_ = 0x3f8000003f800000;
                auVar238._12_4_ = 0x3f800000;
                auVar238._16_4_ = 0x3f800000;
                auVar238._20_4_ = 0x3f800000;
                auVar238._24_4_ = 0x3f800000;
                auVar238._28_4_ = 0x3f800000;
                auVar237 = vandps_avx(auVar237,auVar238);
                auVar237 = vsubps_avx(auVar273,auVar237);
                auVar34._4_4_ = auVar237._4_4_ * 0.6931472;
                auVar34._0_4_ = auVar237._0_4_ * 0.6931472;
                auVar34._8_4_ = auVar237._8_4_ * 0.6931472;
                auVar34._12_4_ = auVar237._12_4_ * 0.6931472;
                auVar34._16_4_ = auVar237._16_4_ * 0.6931472;
                auVar34._20_4_ = auVar237._20_4_ * 0.6931472;
                auVar34._24_4_ = auVar237._24_4_ * 0.6931472;
                auVar34._28_4_ = auVar273._28_4_;
                auVar161 = vsubps_avx(auVar161,auVar34);
                fVar105 = auVar161._0_4_;
                fVar123 = auVar161._4_4_;
                fVar231 = auVar161._8_4_;
                fVar228 = auVar161._12_4_;
                fVar170 = auVar161._16_4_;
                fVar225 = auVar161._20_4_;
                fVar226 = auVar161._24_4_;
                auVar307 = ZEXT3264(auVar307._0_32_);
                auVar104 = ZEXT3264(auVar104._0_32_);
                auVar288._0_4_ =
                     ((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + fVar317) * fVar105 +
                      0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar85;
                auVar288._4_4_ =
                     ((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + fVar318) * fVar123 +
                      0.041665796) * fVar123 + 0.16666666) * fVar123 + fVar122;
                auVar288._8_4_ =
                     ((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + fVar319) * fVar231 +
                      0.041665796) * fVar231 + 0.16666666) * fVar231 + fVar124;
                auVar288._12_4_ =
                     ((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + fVar320) * fVar228 +
                      0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar230;
                auVar288._16_4_ =
                     ((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + fVar321) * fVar170 +
                      0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar223;
                auVar288._20_4_ =
                     ((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + fVar323) * fVar225 +
                      0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar224;
                auVar288._24_4_ =
                     ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + fVar339) * fVar226 +
                      0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar227;
                auVar288._28_4_ = fVar341 + 0.6945454 + 0.041665796 + 0.16666666 + fVar340;
                auVar186._0_4_ = (int)auVar237._0_4_;
                auVar186._4_4_ = (int)auVar237._4_4_;
                auVar186._8_4_ = (int)auVar237._8_4_;
                auVar186._12_4_ = (int)auVar237._12_4_;
                auVar221._16_4_ = (int)auVar237._16_4_;
                auVar221._0_16_ = auVar186;
                auVar221._20_4_ = (int)auVar237._20_4_;
                auVar221._24_4_ = (int)auVar237._24_4_;
                auVar221._28_4_ = (int)auVar237._28_4_;
                auVar239 = vpslld_avx(auVar186,0x17);
                auVar171 = vpslld_avx(auVar221._16_16_,0x17);
                auVar90._8_4_ = 0x3f800000;
                auVar90._0_8_ = 0x3f8000003f800000;
                auVar90._12_4_ = 0x3f800000;
                auVar171 = vpaddd_avx(auVar171,auVar90);
                auVar239 = vpaddd_avx(auVar239,auVar90);
                auVar222._16_16_ = auVar171;
                auVar222._0_16_ = auVar239;
                auVar308 = ZEXT3264(CONCAT428(0x3f800000,
                                              CONCAT424(0x3f800000,
                                                        CONCAT420(0x3f800000,
                                                                  CONCAT416(0x3f800000,
                                                                            CONCAT412(0x3f800000,
                                                                                      CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                auVar167._0_4_ =
                     (fVar105 + 1.0 + fVar105 * fVar105 * auVar288._0_4_) * auVar239._0_4_ + 1.0;
                auVar167._4_4_ =
                     (fVar123 + 1.0 + fVar123 * fVar123 * auVar288._4_4_) * auVar239._4_4_ + 1.0;
                auVar167._8_4_ =
                     (fVar231 + 1.0 + fVar231 * fVar231 * auVar288._8_4_) * auVar239._8_4_ + 1.0;
                auVar167._12_4_ =
                     (fVar228 + 1.0 + fVar228 * fVar228 * auVar288._12_4_) * auVar239._12_4_ + 1.0;
                auVar167._16_4_ =
                     (fVar170 + 1.0 + fVar170 * fVar170 * auVar288._16_4_) * auVar171._0_4_ + 1.0;
                auVar167._20_4_ =
                     (fVar225 + 1.0 + fVar225 * fVar225 * auVar288._20_4_) * auVar171._4_4_ + 1.0;
                auVar167._24_4_ =
                     (fVar226 + 1.0 + fVar226 * fVar226 * auVar288._24_4_) * auVar171._8_4_ + 1.0;
                auVar167._28_4_ = auVar161._28_4_ + 1.0 + auVar273._28_4_ + 1.0;
                auVar102._8_4_ = 0x40000000;
                auVar102._0_8_ = 0x4000000040000000;
                auVar102._12_4_ = 0x40000000;
                auVar102._16_4_ = 0x40000000;
                auVar102._20_4_ = 0x40000000;
                auVar102._24_4_ = 0x40000000;
                auVar102._28_4_ = 0x40000000;
                auVar237 = vdivps_avx(auVar102,auVar167);
                auVar154._0_4_ = auVar237._0_4_ + -1.0;
                auVar154._4_4_ = auVar237._4_4_ + -1.0;
                auVar154._8_4_ = auVar237._8_4_ + -1.0;
                auVar154._12_4_ = auVar237._12_4_ + -1.0;
                auVar154._16_4_ = auVar237._16_4_ + -1.0;
                auVar154._20_4_ = auVar237._20_4_ + -1.0;
                auVar154._24_4_ = auVar237._24_4_ + -1.0;
                goto LAB_0027d9c3;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar222._4_4_ = fVar105;
                auVar222._0_4_ = fVar105;
                auVar222._8_4_ = fVar105;
                auVar222._12_4_ = fVar105;
                auVar222._16_4_ = fVar105;
                auVar222._20_4_ = fVar105;
                auVar222._24_4_ = fVar105;
                auVar222._28_4_ = fVar105;
                auVar169._0_4_ = auVar316._0_4_ * fVar85 + fVar105;
                auVar169._4_4_ = auVar316._4_4_ * fVar85 + fVar105;
                auVar169._8_4_ = fVar343 * fVar85 + fVar105;
                auVar169._12_4_ = fVar345 * fVar85 + fVar105;
                auVar169._16_4_ = fVar347 * fVar85 + fVar105;
                auVar169._20_4_ = fVar349 * fVar85 + fVar105;
                auVar169._24_4_ = fVar322 * fVar85 + fVar105;
                auVar169._28_4_ = fVar85 + fVar105;
                auVar237 = vmaxps_avx(auVar273,auVar169);
                auVar237 = vminps_avx(auVar237,auVar161);
                auVar154 = auVar237._0_28_;
LAB_0027d9c3:
                in_ZMM3 = ZEXT3264(auVar222);
                auVar39._4_4_ = auVar316._4_4_ * auVar154._4_4_;
                auVar39._0_4_ = auVar316._0_4_ * auVar154._0_4_;
                auVar39._8_4_ = fVar343 * auVar154._8_4_;
                auVar39._12_4_ = fVar345 * auVar154._12_4_;
                auVar39._16_4_ = fVar347 * auVar154._16_4_;
                auVar39._20_4_ = fVar349 * auVar154._20_4_;
                auVar39._24_4_ = fVar322 * auVar154._24_4_;
                auVar39._28_4_ = auVar288._28_4_;
                auVar288 = auVar39;
              }
              auVar237 = auVar288;
LAB_0027d9cb:
              *local_1e0 = auVar237;
              local_1e0 = local_1e0 + 1;
              iVar64 = iVar64 + 1;
            }
          }
        }
      }
      if ((iVar78 == 8) && (uVar59 == 1)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).activation_type;
        local_120 = local_198.elemsize * local_198.cstep;
        uVar80 = 0;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        uVar75 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar75 = uVar80;
        }
        uVar43 = local_198.w;
        if (local_198.w < 1) {
          uVar43 = 0;
        }
        uVar50 = local_198.h;
        if (local_198.h < 1) {
          uVar50 = 0;
        }
        local_138 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          local_138 = uVar80;
        }
        iVar53 = (this->super_Deconvolution).stride_w;
        iVar57 = (this->super_Deconvolution).stride_h;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        local_128 = local_198.data;
        iVar76 = bottom_blob->w;
        iVar11 = bottom_blob->h;
        for (; uVar80 != local_138; uVar80 = uVar80 + 1) {
          local_240 = (undefined1 (*) [16])(local_120 * uVar80 + (long)local_128);
          for (uVar77 = 0; uVar77 != uVar50; uVar77 = uVar77 + 1) {
            pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
            sVar17 = (this->weight_data_tm).cstep;
            sVar15 = (this->weight_data_tm).elemsize;
            pvVar83 = (this->weight_data_tm).data;
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar51 = 0; uVar51 != uVar43; uVar51 = uVar51 + 1) {
              if (pvVar16 == (void *)0x0) {
                fVar85 = 0.0;
              }
              else {
                fVar85 = *(float *)((long)pvVar16 + uVar80 * 4);
              }
              fVar105 = 0.0;
              fVar122 = 0.0;
              fVar123 = 0.0;
              fVar231 = 0.0;
              fVar124 = 0.0;
              fVar228 = 0.0;
              fVar230 = 0.0;
              fVar170 = 0.0;
              pvVar71 = (void *)(sVar17 * uVar80 * sVar15 + (long)pvVar83);
              for (uVar54 = 0; uVar54 != uVar75; uVar54 = uVar54 + 1) {
                pvVar67 = pvVar71;
                for (uVar79 = 0; uVar79 != uVar58; uVar79 = uVar79 + 1) {
                  iVar42 = (((int)uVar79 - uVar12) + 1) * iVar56 + uVar77;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                     (iVar60 < iVar11)) {
                    iVar42 = iVar64;
                    for (lVar48 = 0; uVar63 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                         (iVar44 < iVar76)) {
                        pfVar72 = (float *)((long)pvVar67 + lVar48);
                        pfVar1 = (float *)((long)bottom_blob->data +
                                          (long)(iVar44 << 3) * 4 +
                                          (long)iVar60 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar54);
                        fVar105 = *pfVar72 * *pfVar1 + fVar105;
                        fVar122 = pfVar72[1] * pfVar1[1] + fVar122;
                        fVar123 = pfVar72[2] * pfVar1[2] + fVar123;
                        fVar231 = pfVar72[3] * pfVar1[3] + fVar231;
                        fVar124 = pfVar72[4] * pfVar1[4] + fVar124;
                        fVar228 = pfVar72[5] * pfVar1[5] + fVar228;
                        fVar230 = pfVar72[6] * pfVar1[6] + fVar230;
                        fVar170 = pfVar72[7] + fVar170;
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  pvVar67 = (void *)((long)pvVar67 + (long)(int)uVar45 * 0x20);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar45 * uVar12 * 8) * 4);
              }
              auVar110._0_4_ = fVar124 + fVar105;
              auVar110._4_4_ = fVar228 + fVar122;
              auVar110._8_4_ = fVar230 + fVar123;
              auVar110._12_4_ = fVar170 + fVar231;
              auVar171 = vshufpd_avx(auVar110,auVar110,1);
              auVar111._0_4_ = auVar171._0_4_ + auVar110._0_4_;
              auVar111._4_4_ = auVar171._4_4_ + auVar110._4_4_;
              auVar111._8_4_ = auVar171._8_4_ + auVar110._8_4_;
              auVar111._12_4_ = auVar171._12_4_ + auVar110._12_4_;
              auVar171 = vmovshdup_avx(auVar111);
              fVar85 = auVar171._0_4_ + fVar85 + auVar111._0_4_;
              auVar171 = ZEXT416((uint)fVar85);
              fVar105 = fVar85;
              switch(iVar41) {
              case 1:
                auVar171 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT416(0));
                fVar105 = auVar171._0_4_;
                break;
              case 2:
                auVar91._0_12_ = ZEXT812(0);
                auVar91._12_4_ = 0;
                auVar171 = vcmpss_avx(auVar91,auVar171,1);
                auVar133._8_4_ = 0x3f800000;
                auVar133._0_8_ = 0x3f8000003f800000;
                auVar133._12_4_ = 0x3f800000;
                auVar171 = vblendvps_avx(ZEXT416((uint)*pfVar66),auVar133,auVar171);
                fVar105 = auVar171._0_4_;
LAB_0027de35:
                fVar105 = fVar105 * fVar85;
                break;
              case 3:
                auVar171 = vmaxss_avx(auVar171,ZEXT416((uint)*pfVar66));
                fVar105 = auVar171._0_4_;
                if (pfVar66[1] < auVar171._0_4_) {
                  fVar105 = pfVar66[1];
                }
                break;
              case 4:
                auVar171 = vminss_avx(auVar171,ZEXT416(0x42b0c0a5));
                auVar112._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar112._8_4_ = auVar171._8_4_ ^ 0x80000000;
                auVar112._12_4_ = auVar171._12_4_ ^ 0x80000000;
                auVar171 = vcmpss_avx(auVar171,ZEXT416(0xc2b0c0a5),1);
                auVar132._8_4_ = 0x42b0c0a5;
                auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                auVar132._12_4_ = 0x42b0c0a5;
                auVar171 = vblendvps_avx(auVar112,auVar132,auVar171);
                fVar85 = expf(auVar171._0_4_);
                fVar105 = 1.0 / (fVar85 + 1.0);
                break;
              case 5:
                fVar105 = expf(fVar85);
                fVar105 = logf(fVar105 + 1.0);
                fVar105 = tanhf(fVar105);
                fVar105 = fVar105 * fVar85;
                break;
              case 6:
                fVar122 = *pfVar66;
                fVar123 = -pfVar66[1] / fVar122;
                fVar105 = 0.0;
                if ((fVar123 <= fVar85) && (fVar105 = fVar85, fVar85 <= fVar123 + 1.0 / fVar122)) {
                  fVar105 = fVar122 * fVar85 + pfVar66[1];
                  goto LAB_0027de35;
                }
              }
              *(float *)local_240 = fVar105;
              local_240 = (undefined1 (*) [16])((long)local_240 + 4);
              iVar64 = iVar64 + 1;
            }
          }
        }
      }
      if ((iVar78 == 4) && (uVar59 == 4)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar80 = 0;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        uVar75 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar75 = uVar80;
        }
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar315 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar308 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar80 != uVar75; uVar80 = uVar80 + 1) {
          local_240 = (undefined1 (*) [16])
                      (local_198.cstep * uVar80 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar79 = 0;
          uVar54 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar54 = uVar79;
          }
          uVar43 = local_198.w;
          if (local_198.w < 1) {
            uVar43 = 0;
          }
          uVar50 = local_198.h;
          if (local_198.h < 1) {
            uVar50 = 0;
          }
          while (uVar77 = (uint)uVar79, uVar77 != uVar50) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar51 = 0; uVar51 != uVar43; uVar51 = uVar51 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar304 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar304 = ZEXT1664(*(undefined1 (*) [16])((long)pvVar16 + uVar80 * 0x10));
              }
              pvVar83 = bottom_blob->data;
              lVar48 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar80 * (this->weight_data_tm).elemsize +
                       0x30;
              for (uVar79 = 0; uVar79 != uVar54; uVar79 = uVar79 + 1) {
                lVar62 = lVar48;
                for (uVar81 = 0; uVar81 != uVar58; uVar81 = uVar81 + 1) {
                  iVar42 = (((int)uVar81 - uVar12) + 1) * iVar56 + uVar77;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    lVar52 = (long)iVar60 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar79;
                    iVar42 = iVar64;
                    for (lVar65 = 0; uVar63 * 0x40 != lVar65; lVar65 = lVar65 + 0x40) {
                      if (((-1 < iVar42) && (iVar60 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar60 < iVar76)) {
                        lVar46 = (long)(iVar60 << 2);
                        fVar85 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52);
                        fVar105 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 4);
                        fVar122 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 8);
                        fVar123 = *(float *)((long)pvVar83 + lVar46 * 4 + lVar52 + 0xc);
                        pfVar72 = (float *)(lVar62 + -0x30 + lVar65);
                        pfVar1 = (float *)(lVar62 + -0x20 + lVar65);
                        pfVar2 = (float *)(lVar62 + -0x10 + lVar65);
                        pfVar66 = (float *)(lVar62 + lVar65);
                        auVar304 = ZEXT1664(CONCAT412(fVar85 * pfVar72[3] + auVar304._12_4_ +
                                                      fVar105 * pfVar1[3] + fVar122 * pfVar2[3] +
                                                      fVar123 * pfVar66[3],
                                                      CONCAT48(fVar85 * pfVar72[2] + auVar304._8_4_
                                                               + fVar105 * pfVar1[2] +
                                                                 fVar122 * pfVar2[2] +
                                                               fVar123 * pfVar66[2],
                                                               CONCAT44(fVar85 * pfVar72[1] +
                                                                        auVar304._4_4_ +
                                                                        fVar105 * pfVar1[1] +
                                                                        fVar122 * pfVar2[1] +
                                                                        fVar123 * pfVar66[1],
                                                                        fVar85 * *pfVar72 +
                                                                        auVar304._0_4_ +
                                                                        fVar105 * *pfVar1 +
                                                                        fVar122 * *pfVar2 +
                                                                        fVar123 * *pfVar66))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  lVar62 = lVar62 + (long)(int)uVar45 * 0x40;
                }
                lVar48 = lVar48 + (long)(int)(uVar45 * uVar12 * 0x10) * 4;
              }
              auVar171 = auVar304._0_16_;
              auVar260 = auVar171;
              if (5 < iVar57 - 1U) goto switchD_0027e26c_caseD_1;
              auVar239 = auVar104._0_16_;
              auVar260 = vmaxps_avx(auVar171,auVar239);
              auVar106 = auVar308._0_16_;
              fVar105 = auVar315._4_4_;
              fVar123 = auVar315._8_4_;
              fVar228 = auVar315._12_4_;
              fVar223 = auVar315._0_4_;
              fVar85 = auVar308._0_4_;
              fVar122 = auVar308._4_4_;
              fVar231 = auVar308._8_4_;
              fVar124 = auVar308._12_4_;
              fVar230 = auVar304._8_4_;
              fVar170 = auVar304._12_4_;
              switch(iVar57) {
              case 2:
                auVar171 = vminps_avx(auVar171,auVar239);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar252._0_4_ = fVar85 * auVar171._0_4_ + auVar260._0_4_;
                auVar252._4_4_ = fVar85 * auVar171._4_4_ + auVar260._4_4_;
                auVar252._8_4_ = fVar85 * auVar171._8_4_ + auVar260._8_4_;
                auVar252._12_4_ = fVar85 * auVar171._12_4_ + auVar260._12_4_;
                auVar260 = auVar252;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar257._4_4_ = uVar86;
                auVar257._0_4_ = uVar86;
                auVar257._8_4_ = uVar86;
                auVar257._12_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar330._4_4_ = uVar86;
                auVar330._0_4_ = uVar86;
                auVar330._8_4_ = uVar86;
                auVar330._12_4_ = uVar86;
                auVar171 = vmaxps_avx(auVar171,auVar257);
                auVar260 = vminps_avx(auVar330,auVar171);
                break;
              case 4:
                auVar113._0_8_ = auVar304._0_8_ ^ 0x8000000080000000;
                auVar113._8_4_ = -fVar230;
                auVar113._12_4_ = -fVar170;
                auVar138._8_4_ = 0x42b0c0a5;
                auVar138._0_8_ = 0x42b0c0a542b0c0a5;
                auVar138._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar113,auVar138);
                auVar139._8_4_ = 0xc2b0c0a5;
                auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar139._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar139);
                auVar258._0_4_ = fVar223 + auVar172._0_4_ * 1.442695;
                auVar258._4_4_ = fVar105 + auVar172._4_4_ * 1.442695;
                auVar258._8_4_ = fVar123 + auVar172._8_4_ * 1.442695;
                auVar258._12_4_ = fVar228 + auVar172._12_4_ * 1.442695;
                auVar331._0_4_ = (int)auVar258._0_4_;
                auVar331._4_4_ = (int)auVar258._4_4_;
                auVar331._8_4_ = (int)auVar258._8_4_;
                auVar331._12_4_ = (int)auVar258._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar331);
                auVar171 = vcmpps_avx(auVar258,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                fVar230 = auVar171._0_4_ * -0.6931472 + auVar172._0_4_;
                fVar170 = auVar171._4_4_ * -0.6931472 + auVar172._4_4_;
                fVar224 = auVar171._8_4_ * -0.6931472 + auVar172._8_4_;
                fVar225 = auVar171._12_4_ * -0.6931472 + auVar172._12_4_;
                auVar259._0_4_ = (int)auVar171._0_4_;
                auVar259._4_4_ = (int)auVar171._4_4_;
                auVar259._8_4_ = (int)auVar171._8_4_;
                auVar259._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar259,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar114._0_4_ =
                     (fVar230 * fVar230 *
                      (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                         fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar223) +
                     fVar230 + fVar85) * auVar171._0_4_ + fVar85;
                auVar114._4_4_ =
                     (fVar170 * fVar170 *
                      (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                         fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar105) +
                     fVar170 + fVar122) * auVar171._4_4_ + fVar122;
                auVar114._8_4_ =
                     (fVar224 * fVar224 *
                      (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) *
                         fVar224 + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar123) +
                     fVar224 + fVar231) * auVar171._8_4_ + fVar231;
                auVar114._12_4_ =
                     (fVar225 * fVar225 *
                      (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                         fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar228) +
                     fVar225 + fVar124) * auVar171._12_4_ + fVar124;
                auVar260 = vdivps_avx(auVar106,auVar114);
                break;
              case 5:
                auVar233._8_4_ = 0x42b0c0a5;
                auVar233._0_8_ = 0x42b0c0a542b0c0a5;
                auVar233._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar233);
                auVar299._8_4_ = 0xc2b0c0a5;
                auVar299._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar299._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar299,auVar171);
                auVar310._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar310._4_4_ = auVar172._4_4_ * 1.442695 + fVar105;
                auVar310._8_4_ = auVar172._8_4_ * 1.442695 + fVar123;
                auVar310._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar328._0_4_ = (int)auVar310._0_4_;
                auVar328._4_4_ = (int)auVar310._4_4_;
                auVar328._8_4_ = (int)auVar310._8_4_;
                auVar328._12_4_ = (int)auVar310._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar328);
                auVar171 = vcmpps_avx(auVar310,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar329._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar329._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar329._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar329._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar239 = vsubps_avx(auVar172,auVar329);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar253._0_4_ = (int)auVar171._0_4_;
                auVar253._4_4_ = (int)auVar171._4_4_;
                auVar253._8_4_ = (int)auVar171._8_4_;
                auVar253._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar253,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar254._0_4_ =
                     (fVar224 + fVar85 +
                     fVar224 * fVar224 *
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223)) * auVar171._0_4_
                     + fVar85;
                auVar254._4_4_ =
                     (fVar225 + fVar122 +
                     fVar225 * fVar225 *
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar105)) * auVar171._4_4_
                     + fVar122;
                auVar254._8_4_ =
                     (fVar226 + fVar231 +
                     fVar226 * fVar226 *
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar123)) * auVar171._8_4_
                     + fVar231;
                auVar254._12_4_ =
                     (fVar227 + fVar124 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228)) *
                     auVar171._12_4_ + fVar124;
                auVar134._8_4_ = 0x800000;
                auVar134._0_8_ = 0x80000000800000;
                auVar134._12_4_ = 0x800000;
                auVar171 = vmaxps_avx(auVar254,auVar134);
                auVar239 = vpsrld_avx(auVar171,0x17);
                auVar188._8_4_ = 0xffffff82;
                auVar188._0_8_ = 0xffffff82ffffff82;
                auVar188._12_4_ = 0xffffff82;
                auVar239 = vpaddd_avx(auVar239,auVar188);
                auVar189._8_4_ = 0x807fffff;
                auVar189._0_8_ = 0x807fffff807fffff;
                auVar189._12_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar189);
                auVar295 = vorps_avx(auVar171,auVar315._0_16_);
                auVar172 = vcvtdq2ps_avx(auVar239);
                auVar190._8_4_ = 0x3f3504f3;
                auVar190._0_8_ = 0x3f3504f33f3504f3;
                auVar190._12_4_ = 0x3f3504f3;
                auVar239 = vcmpps_avx(auVar295,auVar190,1);
                auVar171 = vandps_avx(auVar239,auVar295);
                fVar224 = auVar295._0_4_ + -1.0 + auVar171._0_4_;
                fVar225 = auVar295._4_4_ + -1.0 + auVar171._4_4_;
                fVar226 = auVar295._8_4_ + -1.0 + auVar171._8_4_;
                fVar227 = auVar295._12_4_ + -1.0 + auVar171._12_4_;
                auVar171 = vandps_avx(auVar239,auVar106);
                auVar239 = vsubps_avx(auVar172,auVar171);
                auVar171 = vcmpps_avx(auVar254,_DAT_00545cc0,2);
                auVar135._0_4_ =
                     (fVar224 * fVar224 *
                      (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) *
                             fVar224 + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057)
                          * fVar224 + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) *
                       fVar224 + -0.5) + auVar239._0_4_ * 0.6931472 + fVar224) * -2.0;
                auVar135._4_4_ =
                     (fVar225 * fVar225 *
                      (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                             fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 + -0.16668057)
                          * fVar225 + 0.20000714) * fVar225 + -0.24999994) * fVar225 + 0.3333333) *
                       fVar225 + -0.5) + auVar239._4_4_ * 0.6931472 + fVar225) * -2.0;
                auVar135._8_4_ =
                     (fVar226 * fVar226 *
                      (((((((((fVar226 * 0.070376836 + -0.1151461) * fVar226 + 0.116769984) *
                             fVar226 + -0.12420141) * fVar226 + 0.14249323) * fVar226 + -0.16668057)
                          * fVar226 + 0.20000714) * fVar226 + -0.24999994) * fVar226 + 0.3333333) *
                       fVar226 + -0.5) + auVar239._8_4_ * 0.6931472 + fVar226) * -2.0;
                auVar135._12_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar239._12_4_ * 0.6931472 + fVar227) * -2.0;
                auVar191._8_4_ = 0x7fffffff;
                auVar191._0_8_ = 0x7fffffff7fffffff;
                auVar191._12_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar135,auVar191,auVar171);
                auVar192._8_4_ = 0x42b0c0a5;
                auVar192._0_8_ = 0x42b0c0a542b0c0a5;
                auVar192._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar192);
                auVar193._8_4_ = 0xc2b0c0a5;
                auVar193._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar193._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar193);
                auVar194._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar194._4_4_ = auVar172._4_4_ * 1.442695 + fVar105;
                auVar194._8_4_ = auVar172._8_4_ * 1.442695 + fVar123;
                auVar194._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar255._0_4_ = (int)auVar194._0_4_;
                auVar255._4_4_ = (int)auVar194._4_4_;
                auVar255._8_4_ = (int)auVar194._8_4_;
                auVar255._12_4_ = (int)auVar194._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar255);
                auVar171 = vcmpps_avx(auVar194,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar256._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar256._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar256._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar256._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar308 = ZEXT1664(auVar106);
                auVar239 = vsubps_avx(auVar172,auVar256);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar104 = ZEXT864(0) << 0x20;
                auVar315 = ZEXT1664(auVar315._0_16_);
                auVar195._0_4_ = (int)auVar171._0_4_;
                auVar195._4_4_ = (int)auVar171._4_4_;
                auVar195._8_4_ = (int)auVar171._8_4_;
                auVar195._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar195,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar136._0_4_ =
                     (fVar224 + fVar85 +
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223) *
                     fVar224 * fVar224) * auVar171._0_4_ + fVar85;
                auVar136._4_4_ =
                     (fVar225 + fVar122 +
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar105) *
                     fVar225 * fVar225) * auVar171._4_4_ + fVar122;
                auVar136._8_4_ =
                     (fVar226 + fVar231 +
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar123) *
                     fVar226 * fVar226) * auVar171._8_4_ + fVar231;
                auVar136._12_4_ =
                     (fVar227 + fVar124 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228) *
                     fVar227 * fVar227) * auVar171._12_4_ + fVar124;
                auVar196._8_4_ = 0x40000000;
                auVar196._0_8_ = 0x4000000040000000;
                auVar196._12_4_ = 0x40000000;
                auVar171 = vdivps_avx(auVar196,auVar136);
                auVar137._0_4_ = auVar171._0_4_ + -1.0;
                auVar137._4_4_ = auVar171._4_4_ + -1.0;
                auVar137._8_4_ = auVar171._8_4_ + -1.0;
                auVar137._12_4_ = auVar171._12_4_ + -1.0;
                goto LAB_0027e663;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar140._0_4_ = fVar85 * auVar304._0_4_ + fVar105;
                auVar140._4_4_ = fVar85 * auVar304._4_4_ + fVar105;
                auVar140._8_4_ = fVar85 * fVar230 + fVar105;
                auVar140._12_4_ = fVar85 * fVar170 + fVar105;
                auVar171 = vmaxps_avx(auVar140,auVar239);
                auVar137 = vminps_avx(auVar171,auVar106);
LAB_0027e663:
                auVar260._0_4_ = auVar137._0_4_ * auVar304._0_4_;
                auVar260._4_4_ = auVar137._4_4_ * auVar304._4_4_;
                auVar260._8_4_ = auVar137._8_4_ * fVar230;
                auVar260._12_4_ = auVar137._12_4_ * fVar170;
              }
switchD_0027e26c_caseD_1:
              *local_240 = auVar260;
              local_240 = local_240 + 1;
              iVar64 = iVar64 + 1;
            }
            uVar79 = (ulong)(uVar77 + 1);
          }
        }
      }
      if ((iVar78 == 1) && (uVar59 == 4)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).stride_w;
        iVar53 = (this->super_Deconvolution).stride_h;
        iVar57 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar63 = 0;
        uVar80 = 0;
        if (0 < (int)uVar45) {
          uVar80 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        uVar75 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          uVar75 = uVar63;
        }
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar315 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar308 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar63 != uVar75; uVar63 = uVar63 + 1) {
          local_240 = (undefined1 (*) [16])
                      (local_198.cstep * uVar63 * local_198.elemsize + (long)local_198.data);
          iVar76 = bottom_blob->w;
          iVar11 = bottom_blob->h;
          uVar79 = 0;
          uVar54 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar54 = uVar79;
          }
          uVar43 = local_198.w;
          if (local_198.w < 1) {
            uVar43 = 0;
          }
          uVar50 = local_198.h;
          if (local_198.h < 1) {
            uVar50 = 0;
          }
          while (uVar77 = (uint)uVar79, uVar77 != uVar50) {
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar51 = 0; uVar51 != uVar43; uVar51 = uVar51 + 1) {
              if (pvVar16 == (void *)0x0) {
                auVar304 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar304 = ZEXT1664(*(undefined1 (*) [16])((long)pvVar16 + uVar63 * 0x10));
              }
              pvVar83 = (void *)((this->weight_data_tm).cstep * uVar63 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar79 = 0; uVar79 != uVar54; uVar79 = uVar79 + 1) {
                pvVar71 = pvVar83;
                for (uVar81 = 0; uVar81 != uVar58; uVar81 = uVar81 + 1) {
                  iVar42 = (((int)uVar81 - uVar12) + 1) * iVar56 + uVar77;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                     (iVar60 < iVar11)) {
                    iVar42 = iVar64;
                    for (lVar48 = 0; uVar80 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar41, iVar42 % iVar41 == 0)) &&
                         (iVar44 < iVar76)) {
                        fVar85 = *(float *)((long)bottom_blob->data +
                                           (long)iVar44 * 4 +
                                           (long)iVar60 *
                                           (long)bottom_blob->w * bottom_blob->elemsize +
                                           bottom_blob->cstep * bottom_blob->elemsize * uVar79);
                        pfVar66 = (float *)((long)pvVar71 + lVar48);
                        auVar304 = ZEXT1664(CONCAT412(fVar85 * pfVar66[3] + auVar304._12_4_,
                                                      CONCAT48(fVar85 * pfVar66[2] + auVar304._8_4_,
                                                               CONCAT44(fVar85 * pfVar66[1] +
                                                                        auVar304._4_4_,
                                                                        fVar85 * *pfVar66 +
                                                                        auVar304._0_4_))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  pvVar71 = (void *)((long)pvVar71 + (long)(int)uVar45 * 0x10);
                }
                pvVar83 = (void *)((long)pvVar83 + (long)(int)(uVar45 * uVar12 * 4) * 4);
              }
              auVar171 = auVar304._0_16_;
              auVar269 = auVar171;
              if (5 < iVar57 - 1U) goto switchD_0027e9d6_caseD_1;
              auVar239 = auVar104._0_16_;
              auVar269 = vmaxps_avx(auVar171,auVar239);
              auVar106 = auVar308._0_16_;
              fVar105 = auVar315._4_4_;
              fVar231 = auVar315._8_4_;
              fVar228 = auVar315._12_4_;
              fVar223 = auVar315._0_4_;
              fVar85 = auVar308._0_4_;
              fVar122 = auVar308._4_4_;
              fVar123 = auVar308._8_4_;
              fVar124 = auVar308._12_4_;
              fVar230 = auVar304._8_4_;
              fVar170 = auVar304._12_4_;
              switch(iVar57) {
              case 2:
                auVar171 = vminps_avx(auVar171,auVar239);
                fVar85 = *(this->super_Deconvolution).activation_params.data;
                auVar261._0_4_ = fVar85 * auVar171._0_4_ + auVar269._0_4_;
                auVar261._4_4_ = fVar85 * auVar171._4_4_ + auVar269._4_4_;
                auVar261._8_4_ = fVar85 * auVar171._8_4_ + auVar269._8_4_;
                auVar261._12_4_ = fVar85 * auVar171._12_4_ + auVar269._12_4_;
                auVar269 = auVar261;
                break;
              case 3:
                puVar14 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar86 = *puVar14;
                auVar266._4_4_ = uVar86;
                auVar266._0_4_ = uVar86;
                auVar266._8_4_ = uVar86;
                auVar266._12_4_ = uVar86;
                uVar86 = puVar14[1];
                auVar334._4_4_ = uVar86;
                auVar334._0_4_ = uVar86;
                auVar334._8_4_ = uVar86;
                auVar334._12_4_ = uVar86;
                auVar171 = vmaxps_avx(auVar171,auVar266);
                auVar269 = vminps_avx(auVar334,auVar171);
                break;
              case 4:
                auVar115._0_8_ = auVar304._0_8_ ^ 0x8000000080000000;
                auVar115._8_4_ = -fVar230;
                auVar115._12_4_ = -fVar170;
                auVar145._8_4_ = 0x42b0c0a5;
                auVar145._0_8_ = 0x42b0c0a542b0c0a5;
                auVar145._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar115,auVar145);
                auVar146._8_4_ = 0xc2b0c0a5;
                auVar146._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar146._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar146);
                auVar267._0_4_ = fVar223 + auVar172._0_4_ * 1.442695;
                auVar267._4_4_ = fVar105 + auVar172._4_4_ * 1.442695;
                auVar267._8_4_ = fVar231 + auVar172._8_4_ * 1.442695;
                auVar267._12_4_ = fVar228 + auVar172._12_4_ * 1.442695;
                auVar335._0_4_ = (int)auVar267._0_4_;
                auVar335._4_4_ = (int)auVar267._4_4_;
                auVar335._8_4_ = (int)auVar267._8_4_;
                auVar335._12_4_ = (int)auVar267._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar335);
                auVar171 = vcmpps_avx(auVar267,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                fVar230 = auVar171._0_4_ * -0.6931472 + auVar172._0_4_;
                fVar170 = auVar171._4_4_ * -0.6931472 + auVar172._4_4_;
                fVar224 = auVar171._8_4_ * -0.6931472 + auVar172._8_4_;
                fVar225 = auVar171._12_4_ * -0.6931472 + auVar172._12_4_;
                auVar268._0_4_ = (int)auVar171._0_4_;
                auVar268._4_4_ = (int)auVar171._4_4_;
                auVar268._8_4_ = (int)auVar171._8_4_;
                auVar268._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar268,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar116._0_4_ =
                     (fVar230 * fVar230 *
                      (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                         fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar223) +
                     fVar230 + fVar85) * auVar171._0_4_ + fVar85;
                auVar116._4_4_ =
                     (fVar170 * fVar170 *
                      (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                         fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar105) +
                     fVar170 + fVar122) * auVar171._4_4_ + fVar122;
                auVar116._8_4_ =
                     (fVar224 * fVar224 *
                      (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) *
                         fVar224 + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar231) +
                     fVar224 + fVar123) * auVar171._8_4_ + fVar123;
                auVar116._12_4_ =
                     (fVar225 * fVar225 *
                      (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) *
                         fVar225 + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar228) +
                     fVar225 + fVar124) * auVar171._12_4_ + fVar124;
                auVar269 = vdivps_avx(auVar106,auVar116);
                break;
              case 5:
                auVar234._8_4_ = 0x42b0c0a5;
                auVar234._0_8_ = 0x42b0c0a542b0c0a5;
                auVar234._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar234);
                auVar300._8_4_ = 0xc2b0c0a5;
                auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar300._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar300,auVar171);
                auVar311._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar311._4_4_ = auVar172._4_4_ * 1.442695 + fVar105;
                auVar311._8_4_ = auVar172._8_4_ * 1.442695 + fVar231;
                auVar311._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar332._0_4_ = (int)auVar311._0_4_;
                auVar332._4_4_ = (int)auVar311._4_4_;
                auVar332._8_4_ = (int)auVar311._8_4_;
                auVar332._12_4_ = (int)auVar311._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar332);
                auVar171 = vcmpps_avx(auVar311,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar333._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar333._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar333._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar333._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar239 = vsubps_avx(auVar172,auVar333);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar262._0_4_ = (int)auVar171._0_4_;
                auVar262._4_4_ = (int)auVar171._4_4_;
                auVar262._8_4_ = (int)auVar171._8_4_;
                auVar262._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar262,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar263._0_4_ =
                     (fVar224 + fVar85 +
                     fVar224 * fVar224 *
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223)) * auVar171._0_4_
                     + fVar85;
                auVar263._4_4_ =
                     (fVar225 + fVar122 +
                     fVar225 * fVar225 *
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar105)) * auVar171._4_4_
                     + fVar122;
                auVar263._8_4_ =
                     (fVar226 + fVar123 +
                     fVar226 * fVar226 *
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231)) * auVar171._8_4_
                     + fVar123;
                auVar263._12_4_ =
                     (fVar227 + fVar124 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228)) *
                     auVar171._12_4_ + fVar124;
                auVar141._8_4_ = 0x800000;
                auVar141._0_8_ = 0x80000000800000;
                auVar141._12_4_ = 0x800000;
                auVar171 = vmaxps_avx(auVar263,auVar141);
                auVar239 = vpsrld_avx(auVar171,0x17);
                auVar197._8_4_ = 0xffffff82;
                auVar197._0_8_ = 0xffffff82ffffff82;
                auVar197._12_4_ = 0xffffff82;
                auVar239 = vpaddd_avx(auVar239,auVar197);
                auVar198._8_4_ = 0x807fffff;
                auVar198._0_8_ = 0x807fffff807fffff;
                auVar198._12_4_ = 0x807fffff;
                auVar171 = vandps_avx(auVar171,auVar198);
                auVar295 = vorps_avx(auVar171,auVar315._0_16_);
                auVar172 = vcvtdq2ps_avx(auVar239);
                auVar199._8_4_ = 0x3f3504f3;
                auVar199._0_8_ = 0x3f3504f33f3504f3;
                auVar199._12_4_ = 0x3f3504f3;
                auVar239 = vcmpps_avx(auVar295,auVar199,1);
                auVar171 = vandps_avx(auVar239,auVar295);
                fVar224 = auVar295._0_4_ + -1.0 + auVar171._0_4_;
                fVar225 = auVar295._4_4_ + -1.0 + auVar171._4_4_;
                fVar226 = auVar295._8_4_ + -1.0 + auVar171._8_4_;
                fVar227 = auVar295._12_4_ + -1.0 + auVar171._12_4_;
                auVar171 = vandps_avx(auVar239,auVar106);
                auVar239 = vsubps_avx(auVar172,auVar171);
                auVar171 = vcmpps_avx(auVar263,_DAT_00545cc0,2);
                auVar142._0_4_ =
                     (fVar224 * fVar224 *
                      (((((((((fVar224 * 0.070376836 + -0.1151461) * fVar224 + 0.116769984) *
                             fVar224 + -0.12420141) * fVar224 + 0.14249323) * fVar224 + -0.16668057)
                          * fVar224 + 0.20000714) * fVar224 + -0.24999994) * fVar224 + 0.3333333) *
                       fVar224 + -0.5) + auVar239._0_4_ * 0.6931472 + fVar224) * -2.0;
                auVar142._4_4_ =
                     (fVar225 * fVar225 *
                      (((((((((fVar225 * 0.070376836 + -0.1151461) * fVar225 + 0.116769984) *
                             fVar225 + -0.12420141) * fVar225 + 0.14249323) * fVar225 + -0.16668057)
                          * fVar225 + 0.20000714) * fVar225 + -0.24999994) * fVar225 + 0.3333333) *
                       fVar225 + -0.5) + auVar239._4_4_ * 0.6931472 + fVar225) * -2.0;
                auVar142._8_4_ =
                     (fVar226 * fVar226 *
                      (((((((((fVar226 * 0.070376836 + -0.1151461) * fVar226 + 0.116769984) *
                             fVar226 + -0.12420141) * fVar226 + 0.14249323) * fVar226 + -0.16668057)
                          * fVar226 + 0.20000714) * fVar226 + -0.24999994) * fVar226 + 0.3333333) *
                       fVar226 + -0.5) + auVar239._8_4_ * 0.6931472 + fVar226) * -2.0;
                auVar142._12_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar239._12_4_ * 0.6931472 + fVar227) * -2.0;
                auVar200._8_4_ = 0x7fffffff;
                auVar200._0_8_ = 0x7fffffff7fffffff;
                auVar200._12_4_ = 0x7fffffff;
                auVar171 = vblendvps_avx(auVar142,auVar200,auVar171);
                auVar201._8_4_ = 0x42b0c0a5;
                auVar201._0_8_ = 0x42b0c0a542b0c0a5;
                auVar201._12_4_ = 0x42b0c0a5;
                auVar171 = vminps_avx(auVar171,auVar201);
                auVar202._8_4_ = 0xc2b0c0a5;
                auVar202._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar202._12_4_ = 0xc2b0c0a5;
                auVar172 = vmaxps_avx(auVar171,auVar202);
                auVar203._0_4_ = auVar172._0_4_ * 1.442695 + fVar223;
                auVar203._4_4_ = auVar172._4_4_ * 1.442695 + fVar105;
                auVar203._8_4_ = auVar172._8_4_ * 1.442695 + fVar231;
                auVar203._12_4_ = auVar172._12_4_ * 1.442695 + fVar228;
                auVar264._0_4_ = (int)auVar203._0_4_;
                auVar264._4_4_ = (int)auVar203._4_4_;
                auVar264._8_4_ = (int)auVar203._8_4_;
                auVar264._12_4_ = (int)auVar203._12_4_;
                auVar239 = vcvtdq2ps_avx(auVar264);
                auVar171 = vcmpps_avx(auVar203,auVar239,1);
                auVar171 = vandps_avx(auVar171,auVar106);
                auVar171 = vsubps_avx(auVar239,auVar171);
                auVar265._0_4_ = auVar171._0_4_ * 0.6931472;
                auVar265._4_4_ = auVar171._4_4_ * 0.6931472;
                auVar265._8_4_ = auVar171._8_4_ * 0.6931472;
                auVar265._12_4_ = auVar171._12_4_ * 0.6931472;
                auVar308 = ZEXT1664(auVar106);
                auVar239 = vsubps_avx(auVar172,auVar265);
                fVar224 = auVar239._0_4_;
                fVar225 = auVar239._4_4_;
                fVar226 = auVar239._8_4_;
                fVar227 = auVar239._12_4_;
                auVar104 = ZEXT864(0) << 0x20;
                auVar315 = ZEXT1664(auVar315._0_16_);
                auVar204._0_4_ = (int)auVar171._0_4_;
                auVar204._4_4_ = (int)auVar171._4_4_;
                auVar204._8_4_ = (int)auVar171._8_4_;
                auVar204._12_4_ = (int)auVar171._12_4_;
                auVar171 = vpslld_avx(auVar204,0x17);
                auVar171 = vpaddd_avx(auVar171,auVar106);
                auVar143._0_4_ =
                     (fVar224 + fVar85 +
                     (((((fVar224 * 0.00019875691 + 0.0013981999) * fVar224 + 0.008333452) * fVar224
                       + 0.041665796) * fVar224 + 0.16666666) * fVar224 + fVar223) *
                     fVar224 * fVar224) * auVar171._0_4_ + fVar85;
                auVar143._4_4_ =
                     (fVar225 + fVar122 +
                     (((((fVar225 * 0.00019875691 + 0.0013981999) * fVar225 + 0.008333452) * fVar225
                       + 0.041665796) * fVar225 + 0.16666666) * fVar225 + fVar105) *
                     fVar225 * fVar225) * auVar171._4_4_ + fVar122;
                auVar143._8_4_ =
                     (fVar226 + fVar123 +
                     (((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                       + 0.041665796) * fVar226 + 0.16666666) * fVar226 + fVar231) *
                     fVar226 * fVar226) * auVar171._8_4_ + fVar123;
                auVar143._12_4_ =
                     (fVar227 + fVar124 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar228) *
                     fVar227 * fVar227) * auVar171._12_4_ + fVar124;
                auVar205._8_4_ = 0x40000000;
                auVar205._0_8_ = 0x4000000040000000;
                auVar205._12_4_ = 0x40000000;
                auVar171 = vdivps_avx(auVar205,auVar143);
                auVar144._0_4_ = auVar171._0_4_ + -1.0;
                auVar144._4_4_ = auVar171._4_4_ + -1.0;
                auVar144._8_4_ = auVar171._8_4_ + -1.0;
                auVar144._12_4_ = auVar171._12_4_ + -1.0;
                goto LAB_0027ede5;
              case 6:
                pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar85 = *pfVar66;
                fVar105 = pfVar66[1];
                auVar147._0_4_ = fVar85 * auVar304._0_4_ + fVar105;
                auVar147._4_4_ = fVar85 * auVar304._4_4_ + fVar105;
                auVar147._8_4_ = fVar85 * fVar230 + fVar105;
                auVar147._12_4_ = fVar85 * fVar170 + fVar105;
                auVar171 = vmaxps_avx(auVar147,auVar239);
                auVar144 = vminps_avx(auVar171,auVar106);
LAB_0027ede5:
                auVar269._0_4_ = auVar144._0_4_ * auVar304._0_4_;
                auVar269._4_4_ = auVar144._4_4_ * auVar304._4_4_;
                auVar269._8_4_ = auVar144._8_4_ * fVar230;
                auVar269._12_4_ = auVar144._12_4_ * fVar170;
              }
switchD_0027e9d6_caseD_1:
              *local_240 = auVar269;
              local_240 = local_240 + 1;
              iVar64 = iVar64 + 1;
            }
            uVar79 = (ulong)(uVar77 + 1);
          }
        }
      }
      if ((iVar78 == 4) && (uVar59 == 1)) {
        uVar45 = (this->super_Deconvolution).kernel_w;
        uVar12 = (this->super_Deconvolution).kernel_h;
        iVar73 = (this->super_Deconvolution).dilation_w;
        iVar56 = (this->super_Deconvolution).dilation_h;
        iVar41 = (this->super_Deconvolution).activation_type;
        local_120 = local_198.elemsize * local_198.cstep;
        uVar80 = 0;
        uVar63 = 0;
        if (0 < (int)uVar45) {
          uVar63 = (ulong)uVar45;
        }
        uVar58 = 0;
        if (0 < (int)uVar12) {
          uVar58 = (ulong)uVar12;
        }
        uVar75 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar75 = uVar80;
        }
        uVar43 = local_198.w;
        if (local_198.w < 1) {
          uVar43 = 0;
        }
        uVar50 = local_198.h;
        if (local_198.h < 1) {
          uVar50 = 0;
        }
        local_138 = (ulong)(uint)local_198.c;
        if (local_198.c < 1) {
          local_138 = uVar80;
        }
        iVar53 = (this->super_Deconvolution).stride_w;
        iVar57 = (this->super_Deconvolution).stride_h;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        local_128 = local_198.data;
        iVar76 = bottom_blob->w;
        iVar11 = bottom_blob->h;
        for (; uVar80 != local_138; uVar80 = uVar80 + 1) {
          local_240 = (undefined1 (*) [16])(local_120 * uVar80 + (long)local_128);
          for (uVar77 = 0; uVar77 != uVar50; uVar77 = uVar77 + 1) {
            pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
            sVar17 = (this->weight_data_tm).cstep;
            sVar15 = (this->weight_data_tm).elemsize;
            pvVar83 = (this->weight_data_tm).data;
            iVar64 = (1 - uVar45) * iVar73;
            for (uVar51 = 0; uVar51 != uVar43; uVar51 = uVar51 + 1) {
              if (pvVar16 == (void *)0x0) {
                fVar85 = 0.0;
              }
              else {
                fVar85 = *(float *)((long)pvVar16 + uVar80 * 4);
              }
              auVar104 = ZEXT1664((undefined1  [16])0x0);
              pvVar71 = (void *)(sVar17 * uVar80 * sVar15 + (long)pvVar83);
              for (uVar54 = 0; uVar54 != uVar75; uVar54 = uVar54 + 1) {
                pvVar67 = pvVar71;
                for (uVar79 = 0; uVar79 != uVar58; uVar79 = uVar79 + 1) {
                  iVar42 = (((int)uVar79 - uVar12) + 1) * iVar56 + uVar77;
                  if (((-1 < iVar42) && (iVar60 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                     (iVar60 < iVar11)) {
                    iVar42 = iVar64;
                    for (lVar48 = 0; uVar63 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar53, iVar42 % iVar53 == 0)) &&
                         (iVar44 < iVar76)) {
                        pfVar72 = (float *)((long)pvVar67 + lVar48);
                        pfVar1 = (float *)((long)bottom_blob->data +
                                          (long)(iVar44 << 2) * 4 +
                                          (long)iVar60 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar54);
                        auVar104 = ZEXT1664(CONCAT412(pfVar72[3] * pfVar1[3] + auVar104._12_4_,
                                                      CONCAT48(pfVar72[2] * pfVar1[2] +
                                                               auVar104._8_4_,
                                                               CONCAT44(pfVar72[1] * pfVar1[1] +
                                                                        auVar104._4_4_,
                                                                        *pfVar72 * *pfVar1 +
                                                                        auVar104._0_4_))));
                      }
                      iVar42 = iVar42 + iVar73;
                    }
                  }
                  pvVar67 = (void *)((long)pvVar67 + (long)(int)uVar45 * 0x10);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar45 * uVar12 * 4) * 4);
              }
              auVar171 = vshufpd_avx(auVar104._0_16_,auVar104._0_16_,1);
              auVar117._0_4_ = auVar171._0_4_ + auVar104._0_4_;
              auVar117._4_4_ = auVar171._4_4_ + auVar104._4_4_;
              auVar117._8_4_ = auVar171._8_4_ + auVar104._8_4_;
              auVar117._12_4_ = auVar171._12_4_ + auVar104._12_4_;
              auVar171 = vmovshdup_avx(auVar117);
              fVar85 = auVar171._0_4_ + fVar85 + auVar117._0_4_;
              auVar171 = ZEXT416((uint)fVar85);
              fVar105 = fVar85;
              switch(iVar41) {
              case 1:
                auVar171 = vmaxss_avx(ZEXT416((uint)fVar85),ZEXT416(0));
                fVar105 = auVar171._0_4_;
                break;
              case 2:
                auVar92._0_12_ = ZEXT812(0);
                auVar92._12_4_ = 0;
                auVar171 = vcmpss_avx(auVar92,auVar171,1);
                auVar149._8_4_ = 0x3f800000;
                auVar149._0_8_ = 0x3f8000003f800000;
                auVar149._12_4_ = 0x3f800000;
                auVar171 = vblendvps_avx(ZEXT416((uint)*pfVar66),auVar149,auVar171);
                fVar105 = auVar171._0_4_;
LAB_0027f240:
                fVar105 = fVar105 * fVar85;
                break;
              case 3:
                auVar171 = vmaxss_avx(auVar171,ZEXT416((uint)*pfVar66));
                fVar105 = auVar171._0_4_;
                if (pfVar66[1] < auVar171._0_4_) {
                  fVar105 = pfVar66[1];
                }
                break;
              case 4:
                auVar171 = vminss_avx(auVar171,ZEXT416(0x42b0c0a5));
                auVar118._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar118._8_4_ = auVar171._8_4_ ^ 0x80000000;
                auVar118._12_4_ = auVar171._12_4_ ^ 0x80000000;
                auVar171 = vcmpss_avx(auVar171,ZEXT416(0xc2b0c0a5),1);
                auVar148._8_4_ = 0x42b0c0a5;
                auVar148._0_8_ = 0x42b0c0a542b0c0a5;
                auVar148._12_4_ = 0x42b0c0a5;
                auVar171 = vblendvps_avx(auVar118,auVar148,auVar171);
                fVar85 = expf(auVar171._0_4_);
                fVar105 = 1.0 / (fVar85 + 1.0);
                break;
              case 5:
                fVar105 = expf(fVar85);
                fVar105 = logf(fVar105 + 1.0);
                fVar105 = tanhf(fVar105);
                fVar105 = fVar105 * fVar85;
                break;
              case 6:
                fVar122 = *pfVar66;
                fVar123 = -pfVar66[1] / fVar122;
                fVar105 = 0.0;
                if ((fVar123 <= fVar85) && (fVar105 = fVar85, fVar85 <= fVar123 + 1.0 / fVar122)) {
                  fVar105 = fVar122 * fVar85 + pfVar66[1];
                  goto LAB_0027f240;
                }
              }
              *(float *)local_240 = fVar105;
              local_240 = (undefined1 (*) [16])((long)local_240 + 4);
              iVar64 = iVar64 + 1;
            }
          }
        }
      }
      pvVar16 = local_198.data;
      if ((iVar78 == 1) && (uVar59 == 1)) {
        uVar45 = (this->super_Deconvolution).num_output;
        local_138 = local_198.cstep * local_198.elemsize;
        lVar48 = (long)local_198.w;
        uVar63 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar63 = 0;
        }
        uVar80 = 0;
        if (0 < local_198.w) {
          uVar80 = (ulong)(uint)local_198.w;
        }
        uVar59 = local_198.h;
        if (local_198.h < 1) {
          uVar59 = 0;
        }
        iVar73 = bottom_blob->w;
        uVar58 = (ulong)uVar45;
        if ((int)uVar45 < 1) {
          uVar58 = 0;
        }
        iVar56 = bottom_blob->h;
        local_150 = -local_150;
        local_148 = (void *)((long)local_148 << 2);
        for (uVar75 = 0; uVar75 != uVar58; uVar75 = uVar75 + 1) {
          local_1e8 = (void *)(local_138 * uVar75 + (long)pvVar16);
          for (uVar45 = 0; uVar45 != uVar59; uVar45 = uVar45 + 1) {
            iVar41 = (this->super_Deconvolution).bias_term;
            iVar53 = (this->super_Deconvolution).activation_type;
            pvVar83 = (this->super_Deconvolution).bias_data.data;
            iVar57 = uVar45 - local_14c;
            sVar17 = (this->weight_data_tm).cstep;
            sVar15 = (this->weight_data_tm).elemsize;
            pvVar71 = (this->weight_data_tm).data;
            pfVar66 = (float *)(this->super_Deconvolution).activation_params.data;
            iVar78 = local_150;
            for (uVar54 = 0; uVar54 != uVar80; uVar54 = uVar54 + 1) {
              if (iVar41 == 0) {
                auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar104 = ZEXT464(*(uint *)((long)pvVar83 + uVar75 * 4));
              }
              iVar76 = (this->super_Deconvolution).stride_h;
              uVar12 = (this->super_Deconvolution).kernel_w;
              uVar43 = (this->super_Deconvolution).kernel_h;
              uVar79 = 0;
              if (0 < (int)uVar12) {
                uVar79 = (ulong)uVar12;
              }
              if ((int)uVar43 < 1) {
                uVar43 = 0;
              }
              iVar11 = (this->super_Deconvolution).stride_w;
              pvVar67 = (void *)(sVar17 * uVar75 * sVar15 + (long)pvVar71);
              for (uVar81 = 0; uVar81 != uVar63; uVar81 = uVar81 + 1) {
                pvVar74 = pvVar67;
                for (uVar61 = 0; uVar61 != uVar43; uVar61 = uVar61 + 1) {
                  iVar64 = (this->super_Deconvolution).dilation_h * (int)uVar61 + iVar57;
                  if (((-1 < iVar64) && (iVar42 = iVar64 / iVar76, iVar64 % iVar76 == 0)) &&
                     (iVar42 < iVar56)) {
                    iVar64 = iVar78;
                    for (uVar82 = 0; uVar79 != uVar82; uVar82 = uVar82 + 1) {
                      if (((-1 < iVar64) && (iVar60 = iVar64 / iVar11, iVar64 % iVar11 == 0)) &&
                         (iVar60 < iVar73)) {
                        auVar104 = ZEXT464((uint)(*(float *)((long)pvVar74 + uVar82 * 4) *
                                                  *(float *)((long)bottom_blob->data +
                                                            (long)iVar60 * 4 +
                                                            (long)iVar42 *
                                                            (long)bottom_blob->w *
                                                            bottom_blob->elemsize +
                                                            bottom_blob->cstep *
                                                            bottom_blob->elemsize * uVar81) +
                                                 auVar104._0_4_));
                      }
                      iVar64 = iVar64 + (this->super_Deconvolution).dilation_w;
                    }
                  }
                  pvVar74 = (void *)((long)pvVar74 + (long)(int)uVar12 * 4);
                }
                pvVar67 = (void *)((long)pvVar67 + (long)local_148);
              }
              auVar171 = auVar104._0_16_;
              fVar105 = auVar104._0_4_;
              fVar85 = fVar105;
              switch(iVar53) {
              case 1:
                auVar171 = vmaxss_avx(auVar171,ZEXT416(0));
                fVar85 = auVar171._0_4_;
                break;
              case 2:
                auVar171 = vcmpss_avx(ZEXT816(0) << 0x40,auVar171,1);
                auVar151._8_4_ = 0x3f800000;
                auVar151._0_8_ = 0x3f8000003f800000;
                auVar151._12_4_ = 0x3f800000;
                auVar171 = vblendvps_avx(ZEXT416((uint)*pfVar66),auVar151,auVar171);
                fVar85 = auVar171._0_4_ * fVar105;
                break;
              case 3:
                auVar171 = vmaxss_avx(auVar171,ZEXT416((uint)*pfVar66));
                fVar85 = auVar171._0_4_;
                if (pfVar66[1] < auVar171._0_4_) {
                  fVar85 = pfVar66[1];
                }
                break;
              case 4:
                auVar171 = vminss_avx(auVar171,ZEXT416(0x42b0c0a5));
                auVar119._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar119._8_4_ = auVar171._8_4_ ^ 0x80000000;
                auVar119._12_4_ = auVar171._12_4_ ^ 0x80000000;
                auVar171 = vcmpss_avx(auVar171,ZEXT416(0xc2b0c0a5),1);
                auVar150._8_4_ = 0x42b0c0a5;
                auVar150._0_8_ = 0x42b0c0a542b0c0a5;
                auVar150._12_4_ = 0x42b0c0a5;
                auVar171 = vblendvps_avx(auVar119,auVar150,auVar171);
                fVar85 = expf(auVar171._0_4_);
                fVar85 = 1.0 / (fVar85 + 1.0);
                break;
              case 5:
                fVar85 = expf(fVar105);
                fVar85 = logf(fVar85 + 1.0);
                fVar85 = tanhf(fVar85);
                fVar85 = fVar85 * fVar105;
                break;
              case 6:
                fVar122 = *pfVar66;
                fVar123 = -pfVar66[1] / fVar122;
                fVar85 = 0.0;
                if ((fVar123 <= fVar105) && (fVar85 = fVar105, fVar105 <= fVar123 + 1.0 / fVar122))
                {
                  fVar85 = (fVar122 * fVar105 + pfVar66[1]) * fVar105;
                }
              }
              *(float *)((long)local_1e8 + uVar54 * 4) = fVar85;
              iVar78 = iVar78 + 1;
            }
            local_1e8 = (void *)((long)local_1e8 + lVar48 * 4);
          }
        }
      }
    }
    pMVar40 = local_130;
    Deconvolution::cut_padding(&this->super_Deconvolution,&local_198,local_130,local_140);
    if ((pMVar40->data == (void *)0x0) || (iVar41 = 0, (long)pMVar40->c * pMVar40->cstep == 0)) {
      iVar41 = -100;
    }
  }
LAB_0027fed8:
  piVar13 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        free(local_198.data);
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}